

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx512_functor::unary_op_log10>(Mat *a,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  ulong uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [24];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  float fVar106;
  float fVar107;
  undefined1 auVar108 [40];
  undefined1 auVar109 [48];
  undefined1 auVar110 [56];
  undefined1 auVar111 [24];
  undefined1 auVar112 [40];
  undefined1 auVar113 [48];
  undefined1 auVar114 [56];
  float fVar115;
  float fVar116;
  undefined4 uVar117;
  long *in_RDI;
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  float fVar121;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_log10 op;
  Mat *m;
  __m512 y;
  __m512 z;
  __m512 tmp;
  __mmask16 mask;
  __m512 e;
  __mmask16 invalid_mask;
  __m512 one;
  __m512i imm0;
  __m256 y_1;
  __m256 z_1;
  __m256 tmp_1;
  __m256 mask_1;
  __m256 e_1;
  __m256 invalid_mask_1;
  __m256 one_1;
  __m256i imm0_1;
  v4sf y_2;
  v4sf z_2;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e_2;
  v4sf invalid_mask_2;
  v4sf one_2;
  v4si emm0;
  undefined8 local_2af0;
  undefined8 uStack_2ae8;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined1 local_2ac0 [64];
  int local_2a7c;
  undefined8 local_2a78;
  undefined8 local_2a70;
  undefined8 local_2a68;
  undefined4 local_2a60;
  long local_2a58;
  undefined4 local_2a50;
  undefined4 local_2a4c;
  undefined4 local_2a48;
  undefined4 local_2a44;
  undefined4 local_2a40;
  undefined8 local_2a38;
  undefined1 (*local_2a30) [64];
  int local_2a28;
  int local_2a24;
  int local_2a20;
  int local_2a1c;
  int local_2a18;
  int local_2a14;
  int local_2a10;
  undefined1 local_2a09 [9];
  long *local_2a00;
  undefined1 local_29f5;
  int local_29f4;
  undefined8 *local_29e8;
  undefined8 *local_29e0;
  undefined8 *local_29d0;
  undefined1 (*local_29c8) [64];
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 uStack_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined1 (*local_2970) [64];
  undefined1 (*local_2968) [64];
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined1 (*local_2930) [64];
  undefined1 (*local_2928) [64];
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined1 (*local_2910) [64];
  long local_2908;
  undefined4 local_28fc;
  long local_28f8;
  undefined1 (*local_28f0) [64];
  undefined4 local_28e4;
  int local_28e0;
  int local_28dc;
  undefined8 *local_28d8;
  undefined4 local_28cc;
  long local_28c8;
  undefined8 *local_28b8;
  undefined1 *local_2890;
  undefined1 *local_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 uStack_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined1 local_2840 [64];
  undefined1 local_2800 [8];
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 uStack_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined1 local_27c0 [64];
  undefined1 local_2780 [64];
  ushort local_2702;
  undefined1 local_2700 [16];
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 uStack_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined2 local_2682;
  float local_2680 [2];
  float afStack_2678 [2];
  float afStack_2670 [2];
  float afStack_2668 [2];
  float afStack_2660 [2];
  float afStack_2658 [2];
  float afStack_2650 [2];
  float afStack_2648 [2];
  undefined1 local_2640 [64];
  undefined1 local_2600 [64];
  undefined1 local_25c0 [64];
  int local_2580 [2];
  int aiStack_2578 [2];
  int aiStack_2570 [2];
  int aiStack_2568 [2];
  int aiStack_2560 [2];
  int aiStack_2558 [2];
  int aiStack_2550 [2];
  int aiStack_2548 [2];
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 uStack_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  float local_2500 [2];
  float afStack_24f8 [2];
  float afStack_24f0 [2];
  float afStack_24e8 [2];
  float afStack_24e0 [2];
  float afStack_24d8 [2];
  float afStack_24d0 [2];
  float afStack_24c8 [2];
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 uStack_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 uStack_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 uStack_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 uStack_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 uStack_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 uStack_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 uStack_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 uStack_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  int local_22c0 [2];
  int aiStack_22b8 [2];
  int aiStack_22b0 [2];
  int aiStack_22a8 [2];
  int aiStack_22a0 [2];
  int aiStack_2298 [2];
  int aiStack_2290 [2];
  int aiStack_2288 [2];
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 uStack_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 uStack_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  float local_2200 [2];
  float afStack_21f8 [2];
  float afStack_21f0 [2];
  float afStack_21e8 [2];
  float afStack_21e0 [2];
  float afStack_21d8 [2];
  float afStack_21d0 [2];
  float afStack_21c8 [2];
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 uStack_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 uStack_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  float local_2140 [2];
  float afStack_2138 [2];
  float afStack_2130 [2];
  float afStack_2128 [2];
  float afStack_2120 [2];
  float afStack_2118 [2];
  float afStack_2110 [2];
  float afStack_2108 [2];
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 uStack_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  float local_20c0 [2];
  float afStack_20b8 [2];
  float afStack_20b0 [2];
  float afStack_20a8 [2];
  float afStack_20a0 [2];
  float afStack_2098 [2];
  float afStack_2090 [2];
  float afStack_2088 [2];
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 uStack_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 uStack_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  float local_2000 [2];
  float afStack_1ff8 [2];
  float afStack_1ff0 [2];
  float afStack_1fe8 [2];
  float afStack_1fe0 [2];
  float afStack_1fd8 [2];
  float afStack_1fd0 [2];
  float afStack_1fc8 [2];
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 uStack_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 uStack_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  float local_1f40 [2];
  float afStack_1f38 [2];
  float afStack_1f30 [2];
  float afStack_1f28 [2];
  float afStack_1f20 [2];
  float afStack_1f18 [2];
  float afStack_1f10 [2];
  float afStack_1f08 [2];
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 uStack_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 uStack_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  float local_1e80 [2];
  float afStack_1e78 [2];
  float afStack_1e70 [2];
  float afStack_1e68 [2];
  float afStack_1e60 [2];
  float afStack_1e58 [2];
  float afStack_1e50 [2];
  float afStack_1e48 [2];
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 uStack_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 uStack_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  float local_1dc0 [2];
  float afStack_1db8 [2];
  float afStack_1db0 [2];
  float afStack_1da8 [2];
  float afStack_1da0 [2];
  float afStack_1d98 [2];
  float afStack_1d90 [2];
  float afStack_1d88 [2];
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 uStack_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 uStack_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  float local_1d00 [2];
  float afStack_1cf8 [2];
  float afStack_1cf0 [2];
  float afStack_1ce8 [2];
  float afStack_1ce0 [2];
  float afStack_1cd8 [2];
  float afStack_1cd0 [2];
  float afStack_1cc8 [2];
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 uStack_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 uStack_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  float local_1c40 [2];
  float afStack_1c38 [2];
  float afStack_1c30 [2];
  float afStack_1c28 [2];
  float afStack_1c20 [2];
  float afStack_1c18 [2];
  float afStack_1c10 [2];
  float afStack_1c08 [2];
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 uStack_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 uStack_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  float local_1b80 [2];
  float afStack_1b78 [2];
  float afStack_1b70 [2];
  float afStack_1b68 [2];
  float afStack_1b60 [2];
  float afStack_1b58 [2];
  float afStack_1b50 [2];
  float afStack_1b48 [2];
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 uStack_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  float local_1b00 [2];
  float afStack_1af8 [2];
  float afStack_1af0 [2];
  float afStack_1ae8 [2];
  float afStack_1ae0 [2];
  float afStack_1ad8 [2];
  float afStack_1ad0 [2];
  float afStack_1ac8 [2];
  float local_1ac0 [2];
  float afStack_1ab8 [2];
  float afStack_1ab0 [2];
  float afStack_1aa8 [2];
  float afStack_1aa0 [2];
  float afStack_1a98 [2];
  float afStack_1a90 [2];
  float afStack_1a88 [2];
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 uStack_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  ushort local_1a02;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 uStack_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  float local_19c0 [2];
  float afStack_19b8 [2];
  float afStack_19b0 [2];
  float afStack_19a8 [2];
  float afStack_19a0 [2];
  float afStack_1998 [2];
  float afStack_1990 [2];
  float afStack_1988 [2];
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 uStack_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 uStack_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  float local_1900 [2];
  float afStack_18f8 [2];
  float afStack_18f0 [2];
  float afStack_18e8 [2];
  float afStack_18e0 [2];
  float afStack_18d8 [2];
  float afStack_18d0 [2];
  float afStack_18c8 [2];
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 uStack_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 uStack_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 uStack_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  float local_1800 [2];
  float afStack_17f8 [2];
  float afStack_17f0 [2];
  float afStack_17e8 [2];
  float afStack_17e0 [2];
  float afStack_17d8 [2];
  float afStack_17d0 [2];
  float afStack_17c8 [2];
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 uStack_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined4 local_1744;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 uStack_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 uStack_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined1 local_16c0 [64];
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 uStack_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  float local_1640 [2];
  float afStack_1638 [2];
  float afStack_1630 [2];
  float afStack_1628 [2];
  float afStack_1620 [2];
  float afStack_1618 [2];
  float afStack_1610 [2];
  float afStack_1608 [2];
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 uStack_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined1 local_15c0 [64];
  undefined1 local_1580 [64];
  undefined1 local_1540 [64];
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 uStack_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 uStack_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  ushort local_1442;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 uStack_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 uStack_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 uStack_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined2 local_1342;
  undefined1 local_1340 [64];
  undefined4 local_12d4;
  undefined8 *local_12d0;
  undefined1 *local_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined1 local_12a0 [8];
  float fStack_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [8];
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [8];
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined1 local_11e0 [32];
  undefined4 local_11c0;
  undefined4 uStack_11bc;
  undefined4 uStack_11b8;
  undefined4 uStack_11b4;
  undefined4 uStack_11b0;
  undefined4 uStack_11ac;
  undefined4 uStack_11a8;
  undefined4 uStack_11a4;
  undefined1 local_11a0 [32];
  undefined1 local_1180 [8];
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined4 local_10e0;
  undefined4 uStack_10dc;
  undefined4 uStack_10d8;
  undefined4 uStack_10d4;
  undefined4 uStack_10d0;
  undefined4 uStack_10cc;
  undefined4 uStack_10c8;
  undefined4 uStack_10c4;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined1 local_10a0 [32];
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  ulong uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined4 local_f40;
  undefined4 uStack_f3c;
  undefined4 uStack_f38;
  undefined4 uStack_f34;
  undefined4 uStack_f30;
  undefined4 uStack_f2c;
  undefined4 uStack_f28;
  undefined4 uStack_f24;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined1 *local_ee8;
  float *local_ee0;
  undefined1 *local_ed8;
  undefined1 *local_ed0;
  float *local_ec8;
  undefined1 *local_ec0;
  float *local_eb8;
  undefined1 *local_eb0;
  undefined1 *local_ea8;
  float *local_ea0;
  undefined1 *local_e98;
  undefined1 *local_e90;
  float *local_e88;
  undefined1 *local_e80;
  undefined1 *local_e78;
  float *local_e70;
  undefined1 *local_e68;
  undefined1 *local_e60;
  float *local_e58;
  undefined1 *local_e50;
  undefined1 *local_e48;
  float *local_e40;
  undefined1 *local_e38;
  undefined1 *local_e30;
  float *local_e28;
  undefined1 *local_e20;
  undefined1 *local_e18;
  float *local_e10;
  undefined1 *local_e08;
  undefined1 *local_e00;
  undefined1 *local_df8;
  float *local_df0;
  float *local_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  float local_d20 [2];
  float afStack_d18 [2];
  float afStack_d10 [2];
  float afStack_d08 [2];
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  float local_cc0 [2];
  float afStack_cb8 [2];
  float afStack_cb0 [2];
  float afStack_ca8 [2];
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  float local_c60 [2];
  float afStack_c58 [2];
  float afStack_c50 [2];
  float afStack_c48 [2];
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  float local_c00 [2];
  float afStack_bf8 [2];
  float afStack_bf0 [2];
  float afStack_be8 [2];
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  float local_ba0 [2];
  float afStack_b98 [2];
  float afStack_b90 [2];
  float afStack_b88 [2];
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  float local_b40 [2];
  float afStack_b38 [2];
  float afStack_b30 [2];
  float afStack_b28 [2];
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float local_ae0 [2];
  float afStack_ad8 [2];
  float afStack_ad0 [2];
  float afStack_ac8 [2];
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  float local_a80 [2];
  float afStack_a78 [2];
  float afStack_a70 [2];
  float afStack_a68 [2];
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  ulong uStack_a08;
  float local_a00 [2];
  float afStack_9f8 [2];
  float afStack_9f0 [2];
  float afStack_9e8 [2];
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  float local_9a0 [2];
  float afStack_998 [2];
  float afStack_990 [2];
  float afStack_988 [2];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  float local_940 [2];
  float afStack_938 [2];
  float afStack_930 [2];
  float afStack_928 [2];
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined4 local_8e4;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined4 local_860;
  undefined4 uStack_85c;
  undefined4 uStack_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined4 uStack_848;
  undefined4 uStack_844;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined4 local_7a4;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined4 local_724;
  undefined1 local_720 [32];
  undefined4 local_6f0;
  undefined4 local_6ec;
  undefined4 local_6e8;
  undefined4 local_6e4;
  undefined4 local_6e0;
  undefined4 local_6dc;
  undefined4 local_6d8;
  undefined4 local_6d4;
  undefined8 *local_6d0;
  undefined1 *local_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined1 local_6b0 [8];
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  undefined8 uStack_698;
  float local_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  undefined1 local_660 [8];
  undefined8 uStack_658;
  undefined1 local_650 [16];
  undefined4 local_640;
  undefined4 uStack_63c;
  undefined4 uStack_638;
  undefined4 uStack_634;
  undefined1 local_630 [16];
  undefined1 local_620 [8];
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined4 local_5d0;
  undefined4 uStack_5cc;
  undefined4 uStack_5c8;
  undefined4 uStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined1 local_5b0 [16];
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined1 local_570 [16];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined1 *local_468;
  float *local_460;
  float *local_458;
  undefined1 *local_450;
  float *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  float *local_430;
  undefined1 *local_428;
  float *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  float *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  float *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  float *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  float *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  float *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  float *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  float *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_350 [2];
  float afStack_348 [2];
  undefined8 local_340;
  undefined8 uStack_338;
  float local_330 [2];
  float afStack_328 [2];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  float local_300 [2];
  float afStack_2f8 [2];
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  float local_2d0 [2];
  float afStack_2c8 [2];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  float local_2a0 [2];
  float afStack_298 [2];
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  float local_270 [2];
  float afStack_268 [2];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  float local_240 [2];
  float afStack_238 [2];
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_210 [2];
  float afStack_208 [2];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1e0 [2];
  float afStack_1d8 [2];
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  float local_1a0 [2];
  float afStack_198 [2];
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  float local_170 [2];
  float afStack_168 [2];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined4 local_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined4 local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined4 local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined4 local_64;
  undefined1 (*local_60) [64];
  undefined1 *local_58;
  
  local_2a10 = *(int *)((long)in_RDI + 0x2c);
  local_2a14 = (int)in_RDI[6];
  local_2a18 = *(int *)((long)in_RDI + 0x34);
  local_2a1c = (int)in_RDI[7];
  local_2a20 = (int)in_RDI[3];
  local_2a24 = local_2a10 * local_2a14 * local_2a18 * local_2a20;
  local_2a00 = in_RDI;
  for (local_2a28 = 0; local_2a28 < local_2a1c; local_2a28 = local_2a28 + 1) {
    local_29e8 = &local_2a78;
    local_28dc = *(int *)((long)local_2a00 + 0x2c);
    local_28e0 = (int)local_2a00[6];
    local_28e4 = *(undefined4 *)((long)local_2a00 + 0x34);
    local_28f0 = (undefined1 (*) [64])
                 (*local_2a00 + local_2a00[8] * (long)local_2a28 * local_2a00[2]);
    local_28f8 = local_2a00[2];
    local_28fc = (undefined4)local_2a00[3];
    local_2908 = local_2a00[4];
    local_28d8 = &local_2a78;
    local_28c8 = (long)local_28dc * (long)local_28e0 * local_28f8;
    local_29e0 = &local_2a78;
    local_29d0 = &local_2a78;
    local_28cc = 0x10;
    local_29f4 = local_2a28;
    local_29f5 = 1;
    local_2a78 = 0;
    local_2a68 = 0;
    local_2a60 = 0;
    local_2a50 = 0;
    local_2a4c = 0;
    local_2a48 = 0;
    local_2a44 = 0;
    local_2a40 = 0;
    local_2a38 = 0;
    local_2a70 = 0;
    local_2a30 = local_28f0;
    for (local_2a7c = 0; uVar21 = uStack_2ac8, local_2a7c + 0xf < local_2a24;
        local_2a7c = local_2a7c + 0x10) {
      local_29c8 = local_2a30;
      auVar119 = *local_2a30;
      local_2888 = local_2a09;
      local_2890 = local_2ac0;
      local_2ac0._56_8_ = auVar119._56_8_;
      uStack_2248 = local_2ac0._56_8_;
      local_2680[0] = 1.0;
      local_2680[1] = 1.0;
      afStack_2678[0] = 1.0;
      afStack_2678[1] = 1.0;
      afStack_2670[0] = 1.0;
      afStack_2670[1] = 1.0;
      afStack_2668[0] = 1.0;
      afStack_2668[1] = 1.0;
      afStack_2660[0] = 1.0;
      afStack_2660[1] = 1.0;
      afStack_2658[0] = 1.0;
      afStack_2658[1] = 1.0;
      afStack_2650[0] = 1.0;
      afStack_2650[1] = 1.0;
      afStack_2648[0] = 1.0;
      afStack_2648[1] = 1.0;
      local_2480 = 0;
      uStack_2478 = 0;
      uStack_2470 = 0;
      uStack_2468 = 0;
      uStack_2460 = 0;
      uStack_2458 = 0;
      uStack_2450 = 0;
      uStack_2448 = 0;
      uVar20 = vcmpps_avx512f(auVar119,ZEXT1664(ZEXT816(0)),2);
      local_2682 = (undefined2)uVar20;
      local_2600._0_8_ = auVar119._0_8_;
      local_2280 = local_2600._0_8_;
      local_2600._8_8_ = auVar119._8_8_;
      uStack_2278 = local_2600._8_8_;
      local_2600._16_8_ = auVar119._16_8_;
      uStack_2270 = local_2600._16_8_;
      local_2600._24_8_ = auVar119._24_8_;
      uStack_2268 = local_2600._24_8_;
      local_2600._32_8_ = auVar119._32_8_;
      uStack_2260 = local_2600._32_8_;
      local_2600._40_8_ = auVar119._40_8_;
      uStack_2258 = local_2600._40_8_;
      local_2600._48_8_ = auVar119._48_8_;
      uStack_2250 = local_2600._48_8_;
      local_22c0[0] = 0x800000;
      local_22c0[1] = 0x800000;
      aiStack_22b8[0] = 0x800000;
      aiStack_22b8[1] = 0x800000;
      aiStack_22b0[0] = 0x800000;
      aiStack_22b0[1] = 0x800000;
      aiStack_22a8[0] = 0x800000;
      aiStack_22a8[1] = 0x800000;
      aiStack_22a0[0] = 0x800000;
      aiStack_22a0[1] = 0x800000;
      aiStack_2298[0] = 0x800000;
      aiStack_2298[1] = 0x800000;
      aiStack_2290[0] = 0x800000;
      aiStack_2290[1] = 0x800000;
      aiStack_2288[0] = 0x800000;
      aiStack_2288[1] = 0x800000;
      auVar38._8_4_ = 0x800000;
      auVar38._12_4_ = 0x800000;
      auVar38._0_4_ = 0x800000;
      auVar38._4_4_ = 0x800000;
      auVar38._16_4_ = 0x800000;
      auVar38._20_4_ = 0x800000;
      auVar38._24_4_ = 0x800000;
      auVar38._28_4_ = 0x800000;
      auVar38._32_4_ = 0x800000;
      auVar38._36_4_ = 0x800000;
      auVar38._40_4_ = 0x800000;
      auVar38._44_4_ = 0x800000;
      auVar38._48_4_ = 0x800000;
      auVar38._52_4_ = 0x800000;
      auVar38._56_4_ = 0x800000;
      auVar38._60_4_ = 0x800000;
      auVar118 = vmaxps_avx512f(auVar119,auVar38);
      local_2600._0_8_ = auVar118._0_8_;
      local_1700 = local_2600._0_8_;
      local_2600._8_8_ = auVar118._8_8_;
      uStack_16f8 = local_2600._8_8_;
      local_2600._16_8_ = auVar118._16_8_;
      uStack_16f0 = local_2600._16_8_;
      local_2600._24_8_ = auVar118._24_8_;
      uStack_16e8 = local_2600._24_8_;
      local_2600._32_8_ = auVar118._32_8_;
      uStack_16e0 = local_2600._32_8_;
      local_2600._40_8_ = auVar118._40_8_;
      uStack_16d8 = local_2600._40_8_;
      local_2600._48_8_ = auVar118._48_8_;
      uStack_16d0 = local_2600._48_8_;
      local_2600._56_8_ = auVar118._56_8_;
      uStack_16c8 = local_2600._56_8_;
      local_1740 = local_2600._0_8_;
      uStack_1738 = local_2600._8_8_;
      uStack_1730 = local_2600._16_8_;
      uStack_1728 = local_2600._24_8_;
      uStack_1720 = local_2600._32_8_;
      uStack_1718 = local_2600._40_8_;
      uStack_1710 = local_2600._48_8_;
      uStack_1708 = local_2600._56_8_;
      local_1744 = 0x17;
      auVar119 = vmovdqa64_avx512f(auVar118);
      auVar119 = vpsrld_avx512f(auVar119,ZEXT416(0x17));
      auVar119 = vmovdqa64_avx512f(auVar119);
      local_2540 = local_2600._0_8_;
      uStack_2538 = local_2600._8_8_;
      uStack_2530 = local_2600._16_8_;
      uStack_2528 = local_2600._24_8_;
      uStack_2520 = local_2600._32_8_;
      uStack_2518 = local_2600._40_8_;
      uStack_2510 = local_2600._48_8_;
      uStack_2508 = local_2600._56_8_;
      local_2580[0] = -0x7f800001;
      local_2580[1] = -0x7f800001;
      aiStack_2578[0] = -0x7f800001;
      aiStack_2578[1] = -0x7f800001;
      aiStack_2570[0] = -0x7f800001;
      aiStack_2570[1] = -0x7f800001;
      aiStack_2568[0] = -0x7f800001;
      aiStack_2568[1] = -0x7f800001;
      aiStack_2560[0] = -0x7f800001;
      aiStack_2560[1] = -0x7f800001;
      aiStack_2558[0] = -0x7f800001;
      aiStack_2558[1] = -0x7f800001;
      aiStack_2550[0] = -0x7f800001;
      aiStack_2550[1] = -0x7f800001;
      aiStack_2548[0] = -0x7f800001;
      aiStack_2548[1] = -0x7f800001;
      auVar120 = vmovdqa64_avx512f(auVar118);
      auVar118._8_4_ = -0x7f800001;
      auVar118._12_4_ = -0x7f800001;
      auVar118._0_4_ = -0x7f800001;
      auVar118._4_4_ = -0x7f800001;
      auVar118._16_4_ = -0x7f800001;
      auVar118._20_4_ = -0x7f800001;
      auVar118._24_4_ = -0x7f800001;
      auVar118._28_4_ = -0x7f800001;
      auVar118._32_4_ = -0x7f800001;
      auVar118._36_4_ = -0x7f800001;
      auVar118._40_4_ = -0x7f800001;
      auVar118._44_4_ = -0x7f800001;
      auVar118._48_4_ = -0x7f800001;
      auVar118._52_4_ = -0x7f800001;
      auVar118._56_4_ = -0x7f800001;
      auVar118._60_4_ = -0x7f800001;
      auVar118 = vmovdqa64_avx512f(auVar118);
      auVar118 = vpandd_avx512f(auVar120,auVar118);
      auVar118 = vmovdqa64_avx512f(auVar118);
      local_2600._0_8_ = auVar118._0_8_;
      local_1600 = local_2600._0_8_;
      local_2600._8_8_ = auVar118._8_8_;
      uStack_15f8 = local_2600._8_8_;
      local_2600._16_8_ = auVar118._16_8_;
      uStack_15f0 = local_2600._16_8_;
      local_2600._24_8_ = auVar118._24_8_;
      uStack_15e8 = local_2600._24_8_;
      local_2600._32_8_ = auVar118._32_8_;
      uStack_15e0 = local_2600._32_8_;
      local_2600._40_8_ = auVar118._40_8_;
      uStack_15d8 = local_2600._40_8_;
      local_2600._48_8_ = auVar118._48_8_;
      uStack_15d0 = local_2600._48_8_;
      local_2600._56_8_ = auVar118._56_8_;
      uStack_15c8 = local_2600._56_8_;
      local_1640[0] = 0.5;
      local_1640[1] = 0.5;
      afStack_1638[0] = 0.5;
      afStack_1638[1] = 0.5;
      afStack_1630[0] = 0.5;
      afStack_1630[1] = 0.5;
      afStack_1628[0] = 0.5;
      afStack_1628[1] = 0.5;
      afStack_1620[0] = 0.5;
      afStack_1620[1] = 0.5;
      afStack_1618[0] = 0.5;
      afStack_1618[1] = 0.5;
      afStack_1610[0] = 0.5;
      afStack_1610[1] = 0.5;
      afStack_1608[0] = 0.5;
      afStack_1608[1] = 0.5;
      auVar118 = vmovdqa64_avx512f(auVar118);
      auVar64._8_4_ = 0.5;
      auVar64._12_4_ = 0.5;
      auVar64._0_4_ = 0.5;
      auVar64._4_4_ = 0.5;
      auVar64._16_4_ = 0.5;
      auVar64._20_4_ = 0.5;
      auVar64._24_4_ = 0.5;
      auVar64._28_4_ = 0.5;
      auVar64._32_4_ = 0.5;
      auVar64._36_4_ = 0.5;
      auVar64._40_4_ = 0.5;
      auVar64._44_4_ = 0.5;
      auVar64._48_4_ = 0.5;
      auVar64._52_4_ = 0.5;
      auVar64._56_4_ = 0.5;
      auVar64._60_4_ = 0.5;
      auVar120 = vmovdqa64_avx512f(auVar64);
      auVar118 = vpord_avx512f(auVar118,auVar120);
      auVar118 = vmovdqa64_avx512f(auVar118);
      auVar119 = vmovdqa64_avx512f(auVar119);
      auVar120 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      local_1580 = vmovdqa64_avx512f(auVar119);
      local_15c0 = vmovdqa64_avx512f(auVar120);
      auVar119 = vmovdqa64_avx512f(local_1580);
      auVar120 = vmovdqa64_avx512f(local_15c0);
      auVar119 = vpsubd_avx512f(auVar119,auVar120);
      local_2640 = vmovdqa64_avx512f(auVar119);
      auVar119 = vmovdqa64_avx512f(local_2640);
      local_1540 = vmovdqa64_avx512f(auVar119);
      auVar119 = vcvtdq2ps_avx512f(local_1540);
      local_2700._0_8_ = auVar119._0_8_;
      local_17c0 = local_2700._0_8_;
      local_2700._8_8_ = auVar119._8_8_;
      uStack_17b8 = local_2700._8_8_;
      uStack_26f0 = auVar119._16_8_;
      uStack_17b0 = uStack_26f0;
      uStack_26e8 = auVar119._24_8_;
      uStack_17a8 = uStack_26e8;
      uStack_26e0 = auVar119._32_8_;
      uStack_17a0 = uStack_26e0;
      uStack_26d8 = auVar119._40_8_;
      uStack_1798 = uStack_26d8;
      uStack_26d0 = auVar119._48_8_;
      uStack_1790 = uStack_26d0;
      uStack_26c8 = auVar119._56_8_;
      uStack_1788 = uStack_26c8;
      local_1800[0] = 1.0;
      local_1800[1] = 1.0;
      afStack_17f8[0] = 1.0;
      afStack_17f8[1] = 1.0;
      afStack_17f0[0] = 1.0;
      afStack_17f0[1] = 1.0;
      afStack_17e8[0] = 1.0;
      afStack_17e8[1] = 1.0;
      afStack_17e0[0] = 1.0;
      afStack_17e0[1] = 1.0;
      afStack_17d8[0] = 1.0;
      afStack_17d8[1] = 1.0;
      afStack_17d0[0] = 1.0;
      afStack_17d0[1] = 1.0;
      afStack_17c8[0] = 1.0;
      afStack_17c8[1] = 1.0;
      auVar63._8_4_ = 1.0;
      auVar63._12_4_ = 1.0;
      auVar63._0_4_ = 1.0;
      auVar63._4_4_ = 1.0;
      auVar63._16_4_ = 1.0;
      auVar63._20_4_ = 1.0;
      auVar63._24_4_ = 1.0;
      auVar63._28_4_ = 1.0;
      auVar63._32_4_ = 1.0;
      auVar63._36_4_ = 1.0;
      auVar63._40_4_ = 1.0;
      auVar63._44_4_ = 1.0;
      auVar63._48_4_ = 1.0;
      auVar63._52_4_ = 1.0;
      auVar63._56_4_ = 1.0;
      auVar63._60_4_ = 1.0;
      auVar120 = vaddps_avx512f(auVar119,auVar63);
      uVar21 = vcmpps_avx512f(auVar118,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      local_2702 = (ushort)uVar21;
      local_2600._0_8_ = auVar118._0_8_;
      local_24c0 = local_2600._0_8_;
      local_2600._8_8_ = auVar118._8_8_;
      uStack_24b8 = local_2600._8_8_;
      local_2600._16_8_ = auVar118._16_8_;
      uStack_24b0 = local_2600._16_8_;
      local_2600._24_8_ = auVar118._24_8_;
      uStack_24a8 = local_2600._24_8_;
      local_2600._32_8_ = auVar118._32_8_;
      uStack_24a0 = local_2600._32_8_;
      local_2600._40_8_ = auVar118._40_8_;
      uStack_2498 = local_2600._40_8_;
      local_2600._48_8_ = auVar118._48_8_;
      uStack_2490 = local_2600._48_8_;
      local_2600._56_8_ = auVar118._56_8_;
      uStack_2488 = local_2600._56_8_;
      local_2500[0] = 1.0;
      local_2500[1] = 1.0;
      afStack_24f8[0] = 1.0;
      afStack_24f8[1] = 1.0;
      afStack_24f0[0] = 1.0;
      afStack_24f0[1] = 1.0;
      afStack_24e8[0] = 1.0;
      afStack_24e8[1] = 1.0;
      afStack_24e0[0] = 1.0;
      afStack_24e0[1] = 1.0;
      afStack_24d8[0] = 1.0;
      afStack_24d8[1] = 1.0;
      afStack_24d0[0] = 1.0;
      afStack_24d0[1] = 1.0;
      afStack_24c8[0] = 1.0;
      afStack_24c8[1] = 1.0;
      auVar119._8_4_ = 1.0;
      auVar119._12_4_ = 1.0;
      auVar119._0_4_ = 1.0;
      auVar119._4_4_ = 1.0;
      auVar119._16_4_ = 1.0;
      auVar119._20_4_ = 1.0;
      auVar119._24_4_ = 1.0;
      auVar119._28_4_ = 1.0;
      auVar119._32_4_ = 1.0;
      auVar119._36_4_ = 1.0;
      auVar119._40_4_ = 1.0;
      auVar119._44_4_ = 1.0;
      auVar119._48_4_ = 1.0;
      auVar119._52_4_ = 1.0;
      auVar119._56_4_ = 1.0;
      auVar119._60_4_ = 1.0;
      local_2780 = vsubps_avx512f(auVar118,auVar119);
      local_2700._0_8_ = auVar120._0_8_;
      local_1a80 = local_2700._0_8_;
      local_2700._8_8_ = auVar120._8_8_;
      uStack_1a78 = local_2700._8_8_;
      uStack_26f0 = auVar120._16_8_;
      uStack_1a70 = uStack_26f0;
      uStack_26e8 = auVar120._24_8_;
      uStack_1a68 = uStack_26e8;
      uStack_26e0 = auVar120._32_8_;
      uStack_1a60 = uStack_26e0;
      uStack_26d8 = auVar120._40_8_;
      uStack_1a58 = uStack_26d8;
      uStack_26d0 = auVar120._48_8_;
      uStack_1a50 = uStack_26d0;
      uStack_26c8 = auVar120._56_8_;
      uStack_1a48 = uStack_26c8;
      local_1ac0[0] = 1.0;
      local_1ac0[1] = 1.0;
      afStack_1ab8[0] = 1.0;
      afStack_1ab8[1] = 1.0;
      afStack_1ab0[0] = 1.0;
      afStack_1ab0[1] = 1.0;
      afStack_1aa8[0] = 1.0;
      afStack_1aa8[1] = 1.0;
      afStack_1aa0[0] = 1.0;
      afStack_1aa0[1] = 1.0;
      afStack_1a98[0] = 1.0;
      afStack_1a98[1] = 1.0;
      afStack_1a90[0] = 1.0;
      afStack_1a90[1] = 1.0;
      afStack_1a88[0] = 1.0;
      afStack_1a88[1] = 1.0;
      local_1980 = local_2700._0_8_;
      uStack_1978 = local_2700._8_8_;
      uStack_1970 = uStack_26f0;
      uStack_1968 = uStack_26e8;
      uStack_1960 = uStack_26e0;
      uStack_1958 = uStack_26d8;
      uStack_1950 = uStack_26d0;
      uStack_1948 = uStack_26c8;
      local_19c0[0] = 1.0;
      local_19c0[1] = 1.0;
      afStack_19b8[0] = 1.0;
      afStack_19b8[1] = 1.0;
      afStack_19b0[0] = 1.0;
      afStack_19b0[1] = 1.0;
      afStack_19a8[0] = 1.0;
      afStack_19a8[1] = 1.0;
      afStack_19a0[0] = 1.0;
      afStack_19a0[1] = 1.0;
      afStack_1998[0] = 1.0;
      afStack_1998[1] = 1.0;
      afStack_1990[0] = 1.0;
      afStack_1990[1] = 1.0;
      afStack_1988[0] = 1.0;
      afStack_1988[1] = 1.0;
      auVar60._8_4_ = 1.0;
      auVar60._12_4_ = 1.0;
      auVar60._0_4_ = 1.0;
      auVar60._4_4_ = 1.0;
      auVar60._16_4_ = 1.0;
      auVar60._20_4_ = 1.0;
      auVar60._24_4_ = 1.0;
      auVar60._28_4_ = 1.0;
      auVar60._32_4_ = 1.0;
      auVar60._36_4_ = 1.0;
      auVar60._40_4_ = 1.0;
      auVar60._44_4_ = 1.0;
      auVar60._48_4_ = 1.0;
      auVar60._52_4_ = 1.0;
      auVar60._56_4_ = 1.0;
      auVar60._60_4_ = 1.0;
      local_1a00._0_4_ = auVar120._0_4_;
      local_1a00._4_4_ = auVar120._4_4_;
      uStack_19f8._0_4_ = auVar120._8_4_;
      uStack_19f8._4_4_ = auVar120._12_4_;
      uStack_19f0._0_4_ = auVar120._16_4_;
      uStack_19f0._4_4_ = auVar120._20_4_;
      uStack_19e8._0_4_ = auVar120._24_4_;
      uStack_19e8._4_4_ = auVar120._28_4_;
      uStack_19e0._0_4_ = auVar120._32_4_;
      uStack_19e0._4_4_ = auVar120._36_4_;
      uStack_19d8._0_4_ = auVar120._40_4_;
      uStack_19d8._4_4_ = auVar120._44_4_;
      uStack_19d0._0_4_ = auVar120._48_4_;
      uStack_19d0._4_4_ = auVar120._52_4_;
      uStack_19c8._0_4_ = auVar120._56_4_;
      uStack_19c8._4_4_ = auVar120._60_4_;
      auVar119 = vsubps_avx512f(auVar120,auVar60);
      bVar1 = (bool)((byte)uVar21 & 1);
      bVar2 = (bool)((byte)(local_2702 >> 1) & 1);
      bVar3 = (bool)((byte)(local_2702 >> 2) & 1);
      bVar4 = (bool)((byte)(local_2702 >> 3) & 1);
      bVar5 = (bool)((byte)(local_2702 >> 4) & 1);
      bVar6 = (bool)((byte)(local_2702 >> 5) & 1);
      bVar7 = (bool)((byte)(local_2702 >> 6) & 1);
      bVar8 = (bool)((byte)(local_2702 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar21 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_2700._4_4_ = (uint)bVar2 * auVar119._4_4_ | (uint)!bVar2 * local_1a00._4_4_;
      local_2700._0_4_ = (uint)bVar1 * auVar119._0_4_ | (uint)!bVar1 * (int)local_1a00;
      local_2700._8_4_ = (uint)bVar3 * auVar119._8_4_ | (uint)!bVar3 * (int)uStack_19f8;
      local_2700._12_4_ = (uint)bVar4 * auVar119._12_4_ | (uint)!bVar4 * uStack_19f8._4_4_;
      uStack_26f0._0_4_ = (uint)bVar5 * auVar119._16_4_ | (uint)!bVar5 * (int)uStack_19f0;
      uStack_26f0._4_4_ = (uint)bVar6 * auVar119._20_4_ | (uint)!bVar6 * uStack_19f0._4_4_;
      auVar101 = _local_2700;
      uStack_26e8._0_4_ = (uint)bVar7 * auVar119._24_4_ | (uint)!bVar7 * (int)uStack_19e8;
      uStack_26e8._4_4_ = (uint)bVar8 * auVar119._28_4_ | (uint)!bVar8 * uStack_19e8._4_4_;
      auVar17 = _local_2700;
      uStack_26e0._0_4_ =
           (uint)(bVar9 & 1) * auVar119._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_19e0;
      uStack_26e0._4_4_ = (uint)bVar10 * auVar119._36_4_ | (uint)!bVar10 * uStack_19e0._4_4_;
      auVar108 = _local_2700;
      uStack_26d8._0_4_ = (uint)bVar11 * auVar119._40_4_ | (uint)!bVar11 * (int)uStack_19d8;
      uStack_26d8._4_4_ = (uint)bVar12 * auVar119._44_4_ | (uint)!bVar12 * uStack_19d8._4_4_;
      auVar109 = _local_2700;
      uStack_26d0._0_4_ = (uint)bVar13 * auVar119._48_4_ | (uint)!bVar13 * (int)uStack_19d0;
      uStack_26d0._4_4_ = (uint)bVar14 * auVar119._52_4_ | (uint)!bVar14 * uStack_19d0._4_4_;
      auVar110 = _local_2700;
      uStack_26c8._0_4_ = (uint)bVar15 * auVar119._56_4_ | (uint)!bVar15 * (int)uStack_19c8;
      uStack_26c8._4_4_ =
           (uint)(bVar9 >> 7) * auVar119._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_19c8._4_4_;
      auVar119 = _local_2700;
      local_14c0 = local_2780._0_8_;
      uStack_14b8 = local_2780._8_8_;
      uStack_14b0 = local_2780._16_8_;
      uStack_14a8 = local_2780._24_8_;
      uStack_14a0 = local_2780._32_8_;
      uStack_1498 = local_2780._40_8_;
      uStack_1490 = local_2780._48_8_;
      uStack_1488 = local_2780._56_8_;
      local_1500 = local_2600._0_8_;
      uStack_14f8 = local_2600._8_8_;
      uStack_14f0 = local_2600._16_8_;
      uStack_14e8 = local_2600._24_8_;
      uStack_14e0 = local_2600._32_8_;
      uStack_14d8 = local_2600._40_8_;
      uStack_14d0 = local_2600._48_8_;
      uStack_14c8 = local_2600._56_8_;
      local_13c0 = local_2780._0_8_;
      uStack_13b8 = local_2780._8_8_;
      uStack_13b0 = local_2780._16_8_;
      uStack_13a8 = local_2780._24_8_;
      uStack_13a0 = local_2780._32_8_;
      uStack_1398 = local_2780._40_8_;
      uStack_1390 = local_2780._48_8_;
      uStack_1388 = local_2780._56_8_;
      local_1400 = local_2600._0_8_;
      uStack_13f8 = local_2600._8_8_;
      uStack_13f0 = local_2600._16_8_;
      uStack_13e8 = local_2600._24_8_;
      uStack_13e0 = local_2600._32_8_;
      uStack_13d8 = local_2600._40_8_;
      uStack_13d0 = local_2600._48_8_;
      uStack_13c8 = local_2600._56_8_;
      local_1440._0_4_ = local_2780._0_4_;
      local_1440._4_4_ = local_2780._4_4_;
      uStack_1438._0_4_ = local_2780._8_4_;
      uStack_1438._4_4_ = local_2780._12_4_;
      uStack_1430._0_4_ = local_2780._16_4_;
      uStack_1430._4_4_ = local_2780._20_4_;
      uStack_1428._0_4_ = local_2780._24_4_;
      uStack_1428._4_4_ = local_2780._28_4_;
      uStack_1420._0_4_ = local_2780._32_4_;
      uStack_1420._4_4_ = local_2780._36_4_;
      uStack_1418._0_4_ = local_2780._40_4_;
      uStack_1418._4_4_ = local_2780._44_4_;
      uStack_1410._0_4_ = local_2780._48_4_;
      uStack_1410._4_4_ = local_2780._52_4_;
      uStack_1408._0_4_ = local_2780._56_4_;
      uStack_1408._4_4_ = local_2780._60_4_;
      auVar118 = vaddps_avx512f(local_2780,auVar118);
      bVar1 = (bool)((byte)uVar21 & 1);
      bVar2 = (bool)((byte)(local_2702 >> 1) & 1);
      bVar3 = (bool)((byte)(local_2702 >> 2) & 1);
      bVar4 = (bool)((byte)(local_2702 >> 3) & 1);
      bVar5 = (bool)((byte)(local_2702 >> 4) & 1);
      bVar6 = (bool)((byte)(local_2702 >> 5) & 1);
      bVar7 = (bool)((byte)(local_2702 >> 6) & 1);
      bVar8 = (bool)((byte)(local_2702 >> 7) & 1);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_2600._4_4_ = (uint)bVar2 * auVar118._4_4_ | (uint)!bVar2 * local_1440._4_4_;
      local_2600._0_4_ = (uint)bVar1 * auVar118._0_4_ | (uint)!bVar1 * (int)local_1440;
      local_2600._8_4_ = (uint)bVar3 * auVar118._8_4_ | (uint)!bVar3 * (int)uStack_1438;
      local_2600._12_4_ = (uint)bVar4 * auVar118._12_4_ | (uint)!bVar4 * uStack_1438._4_4_;
      local_2600._16_4_ = (uint)bVar5 * auVar118._16_4_ | (uint)!bVar5 * (int)uStack_1430;
      local_2600._20_4_ = (uint)bVar6 * auVar118._20_4_ | (uint)!bVar6 * uStack_1430._4_4_;
      auVar111 = local_2600._0_24_;
      local_2600._24_4_ = (uint)bVar7 * auVar118._24_4_ | (uint)!bVar7 * (int)uStack_1428;
      local_2600._28_4_ = (uint)bVar8 * auVar118._28_4_ | (uint)!bVar8 * uStack_1428._4_4_;
      auVar18 = local_2600._0_32_;
      local_2600._32_4_ =
           (uint)(bVar9 & 1) * auVar118._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_1420;
      local_2600._36_4_ = (uint)bVar10 * auVar118._36_4_ | (uint)!bVar10 * uStack_1420._4_4_;
      auVar112 = local_2600._0_40_;
      local_2600._40_4_ = (uint)bVar11 * auVar118._40_4_ | (uint)!bVar11 * (int)uStack_1418;
      local_2600._44_4_ = (uint)bVar12 * auVar118._44_4_ | (uint)!bVar12 * uStack_1418._4_4_;
      auVar113 = local_2600._0_48_;
      local_2600._48_4_ = (uint)bVar13 * auVar118._48_4_ | (uint)!bVar13 * (int)uStack_1410;
      local_2600._52_4_ = (uint)bVar14 * auVar118._52_4_ | (uint)!bVar14 * uStack_1410._4_4_;
      auVar114 = local_2600._0_56_;
      local_2600._56_4_ = (uint)bVar15 * auVar118._56_4_ | (uint)!bVar15 * (int)uStack_1408;
      local_2600._60_4_ =
           (uint)(bVar9 >> 7) * auVar118._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_1408._4_4_;
      auVar118 = local_2600;
      local_2340 = local_2600._0_8_;
      uStack_2338 = local_2600._8_8_;
      local_2600._16_8_ = auVar111._16_8_;
      uStack_2330 = local_2600._16_8_;
      local_2600._24_8_ = auVar18._24_8_;
      uStack_2328 = local_2600._24_8_;
      local_2600._32_8_ = auVar112._32_8_;
      uStack_2320 = local_2600._32_8_;
      local_2600._40_8_ = auVar113._40_8_;
      uStack_2318 = local_2600._40_8_;
      local_2600._48_8_ = auVar114._48_8_;
      uStack_2310 = local_2600._48_8_;
      local_2600._56_8_ = auVar118._56_8_;
      uStack_2308 = local_2600._56_8_;
      auVar37._16_8_ = local_2600._16_8_;
      auVar37._0_16_ = local_2600._0_16_;
      auVar37._24_8_ = local_2600._24_8_;
      auVar37._32_8_ = local_2600._32_8_;
      auVar37._40_8_ = local_2600._40_8_;
      auVar37._48_8_ = local_2600._48_8_;
      auVar37._56_8_ = local_2600._56_8_;
      auVar36._16_8_ = local_2600._16_8_;
      auVar36._0_16_ = local_2600._0_16_;
      auVar36._24_8_ = local_2600._24_8_;
      auVar36._32_8_ = local_2600._32_8_;
      auVar36._40_8_ = local_2600._40_8_;
      auVar36._48_8_ = local_2600._48_8_;
      auVar36._56_8_ = local_2600._56_8_;
      local_27c0 = vmulps_avx512f(auVar37,auVar36);
      uStack_27f8._0_4_ = 0.070376836;
      uStack_27f8._4_4_ = 0.070376836;
      local_2800._0_4_ = 0.070376836;
      local_2800._4_4_ = 0.070376836;
      local_1b00[0] = 0.070376836;
      local_1b00[1] = 0.070376836;
      afStack_1af8[0] = 0.070376836;
      afStack_1af8[1] = 0.070376836;
      afStack_1af0[0] = 0.070376836;
      afStack_1af0[1] = 0.070376836;
      afStack_1ae8[0] = 0.070376836;
      afStack_1ae8[1] = 0.070376836;
      afStack_1ae0[0] = 0.070376836;
      afStack_1ae0[1] = 0.070376836;
      afStack_1ad8[0] = 0.070376836;
      afStack_1ad8[1] = 0.070376836;
      afStack_1ad0[0] = 0.070376836;
      afStack_1ad0[1] = 0.070376836;
      afStack_1ac8[0] = 0.070376836;
      afStack_1ac8[1] = 0.070376836;
      local_1b40 = local_2600._0_8_;
      uStack_1b38 = local_2600._8_8_;
      uStack_1b30 = local_2600._16_8_;
      uStack_1b28 = local_2600._24_8_;
      uStack_1b20 = local_2600._32_8_;
      uStack_1b18 = local_2600._40_8_;
      uStack_1b10 = local_2600._48_8_;
      uStack_1b08 = local_2600._56_8_;
      local_1b80[0] = -0.1151461;
      local_1b80[1] = -0.1151461;
      afStack_1b78[0] = -0.1151461;
      afStack_1b78[1] = -0.1151461;
      afStack_1b70[0] = -0.1151461;
      afStack_1b70[1] = -0.1151461;
      afStack_1b68[0] = -0.1151461;
      afStack_1b68[1] = -0.1151461;
      afStack_1b60[0] = -0.1151461;
      afStack_1b60[1] = -0.1151461;
      afStack_1b58[0] = -0.1151461;
      afStack_1b58[1] = -0.1151461;
      afStack_1b50[0] = -0.1151461;
      afStack_1b50[1] = -0.1151461;
      afStack_1b48[0] = -0.1151461;
      afStack_1b48[1] = -0.1151461;
      auVar59._16_4_ = 0.070376836;
      auVar59._20_4_ = 0.070376836;
      auVar59._0_16_ = _local_2800;
      auVar59._24_4_ = 0.070376836;
      auVar59._28_4_ = 0.070376836;
      auVar59._32_4_ = 0.070376836;
      auVar59._36_4_ = 0.070376836;
      auVar59._40_4_ = 0.070376836;
      auVar59._44_4_ = 0.070376836;
      auVar59._48_4_ = 0.070376836;
      auVar59._52_4_ = 0.070376836;
      auVar59._56_4_ = 0.070376836;
      auVar59._60_4_ = 0.070376836;
      auVar58._16_8_ = local_2600._16_8_;
      auVar58._0_16_ = local_2600._0_16_;
      auVar58._24_8_ = local_2600._24_8_;
      auVar58._32_8_ = local_2600._32_8_;
      auVar58._40_8_ = local_2600._40_8_;
      auVar58._48_8_ = local_2600._48_8_;
      auVar58._56_8_ = local_2600._56_8_;
      auVar57._8_4_ = -0.1151461;
      auVar57._12_4_ = -0.1151461;
      auVar57._0_4_ = -0.1151461;
      auVar57._4_4_ = -0.1151461;
      auVar57._16_4_ = -0.1151461;
      auVar57._20_4_ = -0.1151461;
      auVar57._24_4_ = -0.1151461;
      auVar57._28_4_ = -0.1151461;
      auVar57._32_4_ = -0.1151461;
      auVar57._36_4_ = -0.1151461;
      auVar57._40_4_ = -0.1151461;
      auVar57._44_4_ = -0.1151461;
      auVar57._48_4_ = -0.1151461;
      auVar57._52_4_ = -0.1151461;
      auVar57._56_4_ = -0.1151461;
      auVar57._60_4_ = -0.1151461;
      auVar118 = vfmadd213ps_avx512f(auVar58,auVar59,auVar57);
      local_2800 = auVar118._0_8_;
      local_1bc0 = local_2800;
      uStack_27f8 = auVar118._8_8_;
      uStack_1bb8 = uStack_27f8;
      uStack_27f0 = auVar118._16_8_;
      uStack_1bb0 = uStack_27f0;
      uStack_27e8 = auVar118._24_8_;
      uStack_1ba8 = uStack_27e8;
      uStack_27e0 = auVar118._32_8_;
      uStack_1ba0 = uStack_27e0;
      uStack_27d8 = auVar118._40_8_;
      uStack_1b98 = uStack_27d8;
      uStack_27d0 = auVar118._48_8_;
      uStack_1b90 = uStack_27d0;
      uStack_27c8 = auVar118._56_8_;
      uStack_1b88 = uStack_27c8;
      local_1c00 = local_2600._0_8_;
      uStack_1bf8 = local_2600._8_8_;
      uStack_1bf0 = local_2600._16_8_;
      uStack_1be8 = local_2600._24_8_;
      uStack_1be0 = local_2600._32_8_;
      uStack_1bd8 = local_2600._40_8_;
      uStack_1bd0 = local_2600._48_8_;
      uStack_1bc8 = local_2600._56_8_;
      local_1c40[0] = 0.116769984;
      local_1c40[1] = 0.116769984;
      afStack_1c38[0] = 0.116769984;
      afStack_1c38[1] = 0.116769984;
      afStack_1c30[0] = 0.116769984;
      afStack_1c30[1] = 0.116769984;
      afStack_1c28[0] = 0.116769984;
      afStack_1c28[1] = 0.116769984;
      afStack_1c20[0] = 0.116769984;
      afStack_1c20[1] = 0.116769984;
      afStack_1c18[0] = 0.116769984;
      afStack_1c18[1] = 0.116769984;
      afStack_1c10[0] = 0.116769984;
      afStack_1c10[1] = 0.116769984;
      afStack_1c08[0] = 0.116769984;
      afStack_1c08[1] = 0.116769984;
      auVar56._16_8_ = local_2600._16_8_;
      auVar56._0_16_ = local_2600._0_16_;
      auVar56._24_8_ = local_2600._24_8_;
      auVar56._32_8_ = local_2600._32_8_;
      auVar56._40_8_ = local_2600._40_8_;
      auVar56._48_8_ = local_2600._48_8_;
      auVar56._56_8_ = local_2600._56_8_;
      auVar55._8_4_ = 0.116769984;
      auVar55._12_4_ = 0.116769984;
      auVar55._0_4_ = 0.116769984;
      auVar55._4_4_ = 0.116769984;
      auVar55._16_4_ = 0.116769984;
      auVar55._20_4_ = 0.116769984;
      auVar55._24_4_ = 0.116769984;
      auVar55._28_4_ = 0.116769984;
      auVar55._32_4_ = 0.116769984;
      auVar55._36_4_ = 0.116769984;
      auVar55._40_4_ = 0.116769984;
      auVar55._44_4_ = 0.116769984;
      auVar55._48_4_ = 0.116769984;
      auVar55._52_4_ = 0.116769984;
      auVar55._56_4_ = 0.116769984;
      auVar55._60_4_ = 0.116769984;
      auVar118 = vfmadd213ps_avx512f(auVar56,auVar118,auVar55);
      local_2800 = auVar118._0_8_;
      local_1c80 = local_2800;
      uStack_27f8 = auVar118._8_8_;
      uStack_1c78 = uStack_27f8;
      uStack_27f0 = auVar118._16_8_;
      uStack_1c70 = uStack_27f0;
      uStack_27e8 = auVar118._24_8_;
      uStack_1c68 = uStack_27e8;
      uStack_27e0 = auVar118._32_8_;
      uStack_1c60 = uStack_27e0;
      uStack_27d8 = auVar118._40_8_;
      uStack_1c58 = uStack_27d8;
      uStack_27d0 = auVar118._48_8_;
      uStack_1c50 = uStack_27d0;
      uStack_27c8 = auVar118._56_8_;
      uStack_1c48 = uStack_27c8;
      local_1cc0 = local_2600._0_8_;
      uStack_1cb8 = local_2600._8_8_;
      uStack_1cb0 = local_2600._16_8_;
      uStack_1ca8 = local_2600._24_8_;
      uStack_1ca0 = local_2600._32_8_;
      uStack_1c98 = local_2600._40_8_;
      uStack_1c90 = local_2600._48_8_;
      uStack_1c88 = local_2600._56_8_;
      local_1d00[0] = -0.12420141;
      local_1d00[1] = -0.12420141;
      afStack_1cf8[0] = -0.12420141;
      afStack_1cf8[1] = -0.12420141;
      afStack_1cf0[0] = -0.12420141;
      afStack_1cf0[1] = -0.12420141;
      afStack_1ce8[0] = -0.12420141;
      afStack_1ce8[1] = -0.12420141;
      afStack_1ce0[0] = -0.12420141;
      afStack_1ce0[1] = -0.12420141;
      afStack_1cd8[0] = -0.12420141;
      afStack_1cd8[1] = -0.12420141;
      afStack_1cd0[0] = -0.12420141;
      afStack_1cd0[1] = -0.12420141;
      afStack_1cc8[0] = -0.12420141;
      afStack_1cc8[1] = -0.12420141;
      auVar54._16_8_ = local_2600._16_8_;
      auVar54._0_16_ = local_2600._0_16_;
      auVar54._24_8_ = local_2600._24_8_;
      auVar54._32_8_ = local_2600._32_8_;
      auVar54._40_8_ = local_2600._40_8_;
      auVar54._48_8_ = local_2600._48_8_;
      auVar54._56_8_ = local_2600._56_8_;
      auVar53._8_4_ = -0.12420141;
      auVar53._12_4_ = -0.12420141;
      auVar53._0_4_ = -0.12420141;
      auVar53._4_4_ = -0.12420141;
      auVar53._16_4_ = -0.12420141;
      auVar53._20_4_ = -0.12420141;
      auVar53._24_4_ = -0.12420141;
      auVar53._28_4_ = -0.12420141;
      auVar53._32_4_ = -0.12420141;
      auVar53._36_4_ = -0.12420141;
      auVar53._40_4_ = -0.12420141;
      auVar53._44_4_ = -0.12420141;
      auVar53._48_4_ = -0.12420141;
      auVar53._52_4_ = -0.12420141;
      auVar53._56_4_ = -0.12420141;
      auVar53._60_4_ = -0.12420141;
      auVar118 = vfmadd213ps_avx512f(auVar54,auVar118,auVar53);
      local_2800 = auVar118._0_8_;
      local_1d40 = local_2800;
      uStack_27f8 = auVar118._8_8_;
      uStack_1d38 = uStack_27f8;
      uStack_27f0 = auVar118._16_8_;
      uStack_1d30 = uStack_27f0;
      uStack_27e8 = auVar118._24_8_;
      uStack_1d28 = uStack_27e8;
      uStack_27e0 = auVar118._32_8_;
      uStack_1d20 = uStack_27e0;
      uStack_27d8 = auVar118._40_8_;
      uStack_1d18 = uStack_27d8;
      uStack_27d0 = auVar118._48_8_;
      uStack_1d10 = uStack_27d0;
      uStack_27c8 = auVar118._56_8_;
      uStack_1d08 = uStack_27c8;
      local_1d80 = local_2600._0_8_;
      uStack_1d78 = local_2600._8_8_;
      uStack_1d70 = local_2600._16_8_;
      uStack_1d68 = local_2600._24_8_;
      uStack_1d60 = local_2600._32_8_;
      uStack_1d58 = local_2600._40_8_;
      uStack_1d50 = local_2600._48_8_;
      uStack_1d48 = local_2600._56_8_;
      local_1dc0[0] = 0.14249323;
      local_1dc0[1] = 0.14249323;
      afStack_1db8[0] = 0.14249323;
      afStack_1db8[1] = 0.14249323;
      afStack_1db0[0] = 0.14249323;
      afStack_1db0[1] = 0.14249323;
      afStack_1da8[0] = 0.14249323;
      afStack_1da8[1] = 0.14249323;
      afStack_1da0[0] = 0.14249323;
      afStack_1da0[1] = 0.14249323;
      afStack_1d98[0] = 0.14249323;
      afStack_1d98[1] = 0.14249323;
      afStack_1d90[0] = 0.14249323;
      afStack_1d90[1] = 0.14249323;
      afStack_1d88[0] = 0.14249323;
      afStack_1d88[1] = 0.14249323;
      auVar52._16_8_ = local_2600._16_8_;
      auVar52._0_16_ = local_2600._0_16_;
      auVar52._24_8_ = local_2600._24_8_;
      auVar52._32_8_ = local_2600._32_8_;
      auVar52._40_8_ = local_2600._40_8_;
      auVar52._48_8_ = local_2600._48_8_;
      auVar52._56_8_ = local_2600._56_8_;
      auVar51._8_4_ = 0.14249323;
      auVar51._12_4_ = 0.14249323;
      auVar51._0_4_ = 0.14249323;
      auVar51._4_4_ = 0.14249323;
      auVar51._16_4_ = 0.14249323;
      auVar51._20_4_ = 0.14249323;
      auVar51._24_4_ = 0.14249323;
      auVar51._28_4_ = 0.14249323;
      auVar51._32_4_ = 0.14249323;
      auVar51._36_4_ = 0.14249323;
      auVar51._40_4_ = 0.14249323;
      auVar51._44_4_ = 0.14249323;
      auVar51._48_4_ = 0.14249323;
      auVar51._52_4_ = 0.14249323;
      auVar51._56_4_ = 0.14249323;
      auVar51._60_4_ = 0.14249323;
      auVar118 = vfmadd213ps_avx512f(auVar52,auVar118,auVar51);
      local_2800 = auVar118._0_8_;
      local_1e00 = local_2800;
      uStack_27f8 = auVar118._8_8_;
      uStack_1df8 = uStack_27f8;
      uStack_27f0 = auVar118._16_8_;
      uStack_1df0 = uStack_27f0;
      uStack_27e8 = auVar118._24_8_;
      uStack_1de8 = uStack_27e8;
      uStack_27e0 = auVar118._32_8_;
      uStack_1de0 = uStack_27e0;
      uStack_27d8 = auVar118._40_8_;
      uStack_1dd8 = uStack_27d8;
      uStack_27d0 = auVar118._48_8_;
      uStack_1dd0 = uStack_27d0;
      uStack_27c8 = auVar118._56_8_;
      uStack_1dc8 = uStack_27c8;
      local_1e40 = local_2600._0_8_;
      uStack_1e38 = local_2600._8_8_;
      uStack_1e30 = local_2600._16_8_;
      uStack_1e28 = local_2600._24_8_;
      uStack_1e20 = local_2600._32_8_;
      uStack_1e18 = local_2600._40_8_;
      uStack_1e10 = local_2600._48_8_;
      uStack_1e08 = local_2600._56_8_;
      local_1e80[0] = -0.16668057;
      local_1e80[1] = -0.16668057;
      afStack_1e78[0] = -0.16668057;
      afStack_1e78[1] = -0.16668057;
      afStack_1e70[0] = -0.16668057;
      afStack_1e70[1] = -0.16668057;
      afStack_1e68[0] = -0.16668057;
      afStack_1e68[1] = -0.16668057;
      afStack_1e60[0] = -0.16668057;
      afStack_1e60[1] = -0.16668057;
      afStack_1e58[0] = -0.16668057;
      afStack_1e58[1] = -0.16668057;
      afStack_1e50[0] = -0.16668057;
      afStack_1e50[1] = -0.16668057;
      afStack_1e48[0] = -0.16668057;
      afStack_1e48[1] = -0.16668057;
      auVar50._16_8_ = local_2600._16_8_;
      auVar50._0_16_ = local_2600._0_16_;
      auVar50._24_8_ = local_2600._24_8_;
      auVar50._32_8_ = local_2600._32_8_;
      auVar50._40_8_ = local_2600._40_8_;
      auVar50._48_8_ = local_2600._48_8_;
      auVar50._56_8_ = local_2600._56_8_;
      auVar49._8_4_ = -0.16668057;
      auVar49._12_4_ = -0.16668057;
      auVar49._0_4_ = -0.16668057;
      auVar49._4_4_ = -0.16668057;
      auVar49._16_4_ = -0.16668057;
      auVar49._20_4_ = -0.16668057;
      auVar49._24_4_ = -0.16668057;
      auVar49._28_4_ = -0.16668057;
      auVar49._32_4_ = -0.16668057;
      auVar49._36_4_ = -0.16668057;
      auVar49._40_4_ = -0.16668057;
      auVar49._44_4_ = -0.16668057;
      auVar49._48_4_ = -0.16668057;
      auVar49._52_4_ = -0.16668057;
      auVar49._56_4_ = -0.16668057;
      auVar49._60_4_ = -0.16668057;
      auVar118 = vfmadd213ps_avx512f(auVar50,auVar118,auVar49);
      local_2800 = auVar118._0_8_;
      local_1ec0 = local_2800;
      uStack_27f8 = auVar118._8_8_;
      uStack_1eb8 = uStack_27f8;
      uStack_27f0 = auVar118._16_8_;
      uStack_1eb0 = uStack_27f0;
      uStack_27e8 = auVar118._24_8_;
      uStack_1ea8 = uStack_27e8;
      uStack_27e0 = auVar118._32_8_;
      uStack_1ea0 = uStack_27e0;
      uStack_27d8 = auVar118._40_8_;
      uStack_1e98 = uStack_27d8;
      uStack_27d0 = auVar118._48_8_;
      uStack_1e90 = uStack_27d0;
      uStack_27c8 = auVar118._56_8_;
      uStack_1e88 = uStack_27c8;
      local_1f00 = local_2600._0_8_;
      uStack_1ef8 = local_2600._8_8_;
      uStack_1ef0 = local_2600._16_8_;
      uStack_1ee8 = local_2600._24_8_;
      uStack_1ee0 = local_2600._32_8_;
      uStack_1ed8 = local_2600._40_8_;
      uStack_1ed0 = local_2600._48_8_;
      uStack_1ec8 = local_2600._56_8_;
      local_1f40[0] = 0.20000714;
      local_1f40[1] = 0.20000714;
      afStack_1f38[0] = 0.20000714;
      afStack_1f38[1] = 0.20000714;
      afStack_1f30[0] = 0.20000714;
      afStack_1f30[1] = 0.20000714;
      afStack_1f28[0] = 0.20000714;
      afStack_1f28[1] = 0.20000714;
      afStack_1f20[0] = 0.20000714;
      afStack_1f20[1] = 0.20000714;
      afStack_1f18[0] = 0.20000714;
      afStack_1f18[1] = 0.20000714;
      afStack_1f10[0] = 0.20000714;
      afStack_1f10[1] = 0.20000714;
      afStack_1f08[0] = 0.20000714;
      afStack_1f08[1] = 0.20000714;
      auVar48._16_8_ = local_2600._16_8_;
      auVar48._0_16_ = local_2600._0_16_;
      auVar48._24_8_ = local_2600._24_8_;
      auVar48._32_8_ = local_2600._32_8_;
      auVar48._40_8_ = local_2600._40_8_;
      auVar48._48_8_ = local_2600._48_8_;
      auVar48._56_8_ = local_2600._56_8_;
      auVar47._8_4_ = 0.20000714;
      auVar47._12_4_ = 0.20000714;
      auVar47._0_4_ = 0.20000714;
      auVar47._4_4_ = 0.20000714;
      auVar47._16_4_ = 0.20000714;
      auVar47._20_4_ = 0.20000714;
      auVar47._24_4_ = 0.20000714;
      auVar47._28_4_ = 0.20000714;
      auVar47._32_4_ = 0.20000714;
      auVar47._36_4_ = 0.20000714;
      auVar47._40_4_ = 0.20000714;
      auVar47._44_4_ = 0.20000714;
      auVar47._48_4_ = 0.20000714;
      auVar47._52_4_ = 0.20000714;
      auVar47._56_4_ = 0.20000714;
      auVar47._60_4_ = 0.20000714;
      auVar118 = vfmadd213ps_avx512f(auVar48,auVar118,auVar47);
      local_2800 = auVar118._0_8_;
      local_1f80 = local_2800;
      uStack_27f8 = auVar118._8_8_;
      uStack_1f78 = uStack_27f8;
      uStack_27f0 = auVar118._16_8_;
      uStack_1f70 = uStack_27f0;
      uStack_27e8 = auVar118._24_8_;
      uStack_1f68 = uStack_27e8;
      uStack_27e0 = auVar118._32_8_;
      uStack_1f60 = uStack_27e0;
      uStack_27d8 = auVar118._40_8_;
      uStack_1f58 = uStack_27d8;
      uStack_27d0 = auVar118._48_8_;
      uStack_1f50 = uStack_27d0;
      uStack_27c8 = auVar118._56_8_;
      uStack_1f48 = uStack_27c8;
      local_1fc0 = local_2600._0_8_;
      uStack_1fb8 = local_2600._8_8_;
      uStack_1fb0 = local_2600._16_8_;
      uStack_1fa8 = local_2600._24_8_;
      uStack_1fa0 = local_2600._32_8_;
      uStack_1f98 = local_2600._40_8_;
      uStack_1f90 = local_2600._48_8_;
      uStack_1f88 = local_2600._56_8_;
      local_2000[0] = -0.24999994;
      local_2000[1] = -0.24999994;
      afStack_1ff8[0] = -0.24999994;
      afStack_1ff8[1] = -0.24999994;
      afStack_1ff0[0] = -0.24999994;
      afStack_1ff0[1] = -0.24999994;
      afStack_1fe8[0] = -0.24999994;
      afStack_1fe8[1] = -0.24999994;
      afStack_1fe0[0] = -0.24999994;
      afStack_1fe0[1] = -0.24999994;
      afStack_1fd8[0] = -0.24999994;
      afStack_1fd8[1] = -0.24999994;
      afStack_1fd0[0] = -0.24999994;
      afStack_1fd0[1] = -0.24999994;
      afStack_1fc8[0] = -0.24999994;
      afStack_1fc8[1] = -0.24999994;
      auVar46._16_8_ = local_2600._16_8_;
      auVar46._0_16_ = local_2600._0_16_;
      auVar46._24_8_ = local_2600._24_8_;
      auVar46._32_8_ = local_2600._32_8_;
      auVar46._40_8_ = local_2600._40_8_;
      auVar46._48_8_ = local_2600._48_8_;
      auVar46._56_8_ = local_2600._56_8_;
      auVar45._8_4_ = -0.24999994;
      auVar45._12_4_ = -0.24999994;
      auVar45._0_4_ = -0.24999994;
      auVar45._4_4_ = -0.24999994;
      auVar45._16_4_ = -0.24999994;
      auVar45._20_4_ = -0.24999994;
      auVar45._24_4_ = -0.24999994;
      auVar45._28_4_ = -0.24999994;
      auVar45._32_4_ = -0.24999994;
      auVar45._36_4_ = -0.24999994;
      auVar45._40_4_ = -0.24999994;
      auVar45._44_4_ = -0.24999994;
      auVar45._48_4_ = -0.24999994;
      auVar45._52_4_ = -0.24999994;
      auVar45._56_4_ = -0.24999994;
      auVar45._60_4_ = -0.24999994;
      auVar118 = vfmadd213ps_avx512f(auVar46,auVar118,auVar45);
      local_2800 = auVar118._0_8_;
      local_2040 = local_2800;
      uStack_27f8 = auVar118._8_8_;
      uStack_2038 = uStack_27f8;
      uStack_27f0 = auVar118._16_8_;
      uStack_2030 = uStack_27f0;
      uStack_27e8 = auVar118._24_8_;
      uStack_2028 = uStack_27e8;
      uStack_27e0 = auVar118._32_8_;
      uStack_2020 = uStack_27e0;
      uStack_27d8 = auVar118._40_8_;
      uStack_2018 = uStack_27d8;
      uStack_27d0 = auVar118._48_8_;
      uStack_2010 = uStack_27d0;
      uStack_27c8 = auVar118._56_8_;
      uStack_2008 = uStack_27c8;
      local_2080 = local_2600._0_8_;
      uStack_2078 = local_2600._8_8_;
      uStack_2070 = local_2600._16_8_;
      uStack_2068 = local_2600._24_8_;
      uStack_2060 = local_2600._32_8_;
      uStack_2058 = local_2600._40_8_;
      uStack_2050 = local_2600._48_8_;
      uStack_2048 = local_2600._56_8_;
      local_20c0[0] = 0.3333333;
      local_20c0[1] = 0.3333333;
      afStack_20b8[0] = 0.3333333;
      afStack_20b8[1] = 0.3333333;
      afStack_20b0[0] = 0.3333333;
      afStack_20b0[1] = 0.3333333;
      afStack_20a8[0] = 0.3333333;
      afStack_20a8[1] = 0.3333333;
      afStack_20a0[0] = 0.3333333;
      afStack_20a0[1] = 0.3333333;
      afStack_2098[0] = 0.3333333;
      afStack_2098[1] = 0.3333333;
      afStack_2090[0] = 0.3333333;
      afStack_2090[1] = 0.3333333;
      afStack_2088[0] = 0.3333333;
      afStack_2088[1] = 0.3333333;
      auVar44._16_8_ = local_2600._16_8_;
      auVar44._0_16_ = local_2600._0_16_;
      auVar44._24_8_ = local_2600._24_8_;
      auVar44._32_8_ = local_2600._32_8_;
      auVar44._40_8_ = local_2600._40_8_;
      auVar44._48_8_ = local_2600._48_8_;
      auVar44._56_8_ = local_2600._56_8_;
      auVar43._8_4_ = 0.3333333;
      auVar43._12_4_ = 0.3333333;
      auVar43._0_4_ = 0.3333333;
      auVar43._4_4_ = 0.3333333;
      auVar43._16_4_ = 0.3333333;
      auVar43._20_4_ = 0.3333333;
      auVar43._24_4_ = 0.3333333;
      auVar43._28_4_ = 0.3333333;
      auVar43._32_4_ = 0.3333333;
      auVar43._36_4_ = 0.3333333;
      auVar43._40_4_ = 0.3333333;
      auVar43._44_4_ = 0.3333333;
      auVar43._48_4_ = 0.3333333;
      auVar43._52_4_ = 0.3333333;
      auVar43._56_4_ = 0.3333333;
      auVar43._60_4_ = 0.3333333;
      auVar118 = vfmadd213ps_avx512f(auVar44,auVar118,auVar43);
      local_2800 = auVar118._0_8_;
      local_2380 = local_2800;
      uStack_27f8 = auVar118._8_8_;
      uStack_2378 = uStack_27f8;
      uStack_27f0 = auVar118._16_8_;
      uStack_2370 = uStack_27f0;
      uStack_27e8 = auVar118._24_8_;
      uStack_2368 = uStack_27e8;
      uStack_27e0 = auVar118._32_8_;
      uStack_2360 = uStack_27e0;
      uStack_27d8 = auVar118._40_8_;
      uStack_2358 = uStack_27d8;
      uStack_27d0 = auVar118._48_8_;
      uStack_2350 = uStack_27d0;
      uStack_27c8 = auVar118._56_8_;
      uStack_2348 = uStack_27c8;
      local_23c0 = local_2600._0_8_;
      uStack_23b8 = local_2600._8_8_;
      uStack_23b0 = local_2600._16_8_;
      uStack_23a8 = local_2600._24_8_;
      uStack_23a0 = local_2600._32_8_;
      uStack_2398 = local_2600._40_8_;
      uStack_2390 = local_2600._48_8_;
      uStack_2388 = local_2600._56_8_;
      auVar120._16_8_ = local_2600._16_8_;
      auVar120._0_16_ = local_2600._0_16_;
      auVar120._24_8_ = local_2600._24_8_;
      auVar120._32_8_ = local_2600._32_8_;
      auVar120._40_8_ = local_2600._40_8_;
      auVar120._48_8_ = local_2600._48_8_;
      auVar120._56_8_ = local_2600._56_8_;
      auVar118 = vmulps_avx512f(auVar118,auVar120);
      local_2800 = auVar118._0_8_;
      local_2400 = local_2800;
      uStack_27f8 = auVar118._8_8_;
      uStack_23f8 = uStack_27f8;
      uStack_27f0 = auVar118._16_8_;
      uStack_23f0 = uStack_27f0;
      uStack_27e8 = auVar118._24_8_;
      uStack_23e8 = uStack_27e8;
      uStack_27e0 = auVar118._32_8_;
      uStack_23e0 = uStack_27e0;
      uStack_27d8 = auVar118._40_8_;
      uStack_23d8 = uStack_27d8;
      uStack_27d0 = auVar118._48_8_;
      uStack_23d0 = uStack_27d0;
      uStack_27c8 = auVar118._56_8_;
      uStack_23c8 = uStack_27c8;
      local_2440 = local_27c0._0_8_;
      uStack_2438 = local_27c0._8_8_;
      uStack_2430 = local_27c0._16_8_;
      uStack_2428 = local_27c0._24_8_;
      uStack_2420 = local_27c0._32_8_;
      uStack_2418 = local_27c0._40_8_;
      uStack_2410 = local_27c0._48_8_;
      uStack_2408 = local_27c0._56_8_;
      auVar118 = vmulps_avx512f(auVar118,local_27c0);
      local_2100 = local_2700._0_8_;
      uStack_20f8 = local_2700._8_8_;
      uStack_26f0 = auVar101._16_8_;
      uStack_20f0 = uStack_26f0;
      uStack_26e8 = auVar17._24_8_;
      uStack_20e8 = uStack_26e8;
      uStack_26e0 = auVar108._32_8_;
      uStack_20e0 = uStack_26e0;
      uStack_26d8 = auVar109._40_8_;
      uStack_20d8 = uStack_26d8;
      uStack_26d0 = auVar110._48_8_;
      uStack_20d0 = uStack_26d0;
      uStack_26c8 = auVar119._56_8_;
      uStack_20c8 = uStack_26c8;
      local_2140[0] = -0.00021219444;
      local_2140[1] = -0.00021219444;
      afStack_2138[0] = -0.00021219444;
      afStack_2138[1] = -0.00021219444;
      afStack_2130[0] = -0.00021219444;
      afStack_2130[1] = -0.00021219444;
      afStack_2128[0] = -0.00021219444;
      afStack_2128[1] = -0.00021219444;
      afStack_2120[0] = -0.00021219444;
      afStack_2120[1] = -0.00021219444;
      afStack_2118[0] = -0.00021219444;
      afStack_2118[1] = -0.00021219444;
      afStack_2110[0] = -0.00021219444;
      afStack_2110[1] = -0.00021219444;
      afStack_2108[0] = -0.00021219444;
      afStack_2108[1] = -0.00021219444;
      local_2800 = auVar118._0_8_;
      local_2180 = local_2800;
      uStack_27f8 = auVar118._8_8_;
      uStack_2178 = uStack_27f8;
      uStack_27f0 = auVar118._16_8_;
      uStack_2170 = uStack_27f0;
      uStack_27e8 = auVar118._24_8_;
      uStack_2168 = uStack_27e8;
      uStack_27e0 = auVar118._32_8_;
      uStack_2160 = uStack_27e0;
      uStack_27d8 = auVar118._40_8_;
      uStack_2158 = uStack_27d8;
      uStack_27d0 = auVar118._48_8_;
      uStack_2150 = uStack_27d0;
      uStack_27c8 = auVar118._56_8_;
      uStack_2148 = uStack_27c8;
      auVar42._16_8_ = uStack_26f0;
      auVar42._0_16_ = local_2700;
      auVar42._24_8_ = uStack_26e8;
      auVar42._32_8_ = uStack_26e0;
      auVar42._40_8_ = uStack_26d8;
      auVar42._48_8_ = uStack_26d0;
      auVar42._56_8_ = uStack_26c8;
      auVar41._8_4_ = -0.00021219444;
      auVar41._12_4_ = -0.00021219444;
      auVar41._0_4_ = -0.00021219444;
      auVar41._4_4_ = -0.00021219444;
      auVar41._16_4_ = -0.00021219444;
      auVar41._20_4_ = -0.00021219444;
      auVar41._24_4_ = -0.00021219444;
      auVar41._28_4_ = -0.00021219444;
      auVar41._32_4_ = -0.00021219444;
      auVar41._36_4_ = -0.00021219444;
      auVar41._40_4_ = -0.00021219444;
      auVar41._44_4_ = -0.00021219444;
      auVar41._48_4_ = -0.00021219444;
      auVar41._52_4_ = -0.00021219444;
      auVar41._56_4_ = -0.00021219444;
      auVar41._60_4_ = -0.00021219444;
      auVar118 = vfmadd213ps_avx512f(auVar41,auVar42,auVar118);
      local_18c0 = local_27c0._0_8_;
      uStack_18b8 = local_27c0._8_8_;
      uStack_18b0 = local_27c0._16_8_;
      uStack_18a8 = local_27c0._24_8_;
      uStack_18a0 = local_27c0._32_8_;
      uStack_1898 = local_27c0._40_8_;
      uStack_1890 = local_27c0._48_8_;
      uStack_1888 = local_27c0._56_8_;
      local_1900[0] = 0.5;
      local_1900[1] = 0.5;
      afStack_18f8[0] = 0.5;
      afStack_18f8[1] = 0.5;
      afStack_18f0[0] = 0.5;
      afStack_18f0[1] = 0.5;
      afStack_18e8[0] = 0.5;
      afStack_18e8[1] = 0.5;
      afStack_18e0[0] = 0.5;
      afStack_18e0[1] = 0.5;
      afStack_18d8[0] = 0.5;
      afStack_18d8[1] = 0.5;
      afStack_18d0[0] = 0.5;
      afStack_18d0[1] = 0.5;
      afStack_18c8[0] = 0.5;
      afStack_18c8[1] = 0.5;
      local_2800 = auVar118._0_8_;
      local_1940 = local_2800;
      uStack_27f8 = auVar118._8_8_;
      uStack_1938 = uStack_27f8;
      uStack_27f0 = auVar118._16_8_;
      uStack_1930 = uStack_27f0;
      uStack_27e8 = auVar118._24_8_;
      uStack_1928 = uStack_27e8;
      uStack_27e0 = auVar118._32_8_;
      uStack_1920 = uStack_27e0;
      uStack_27d8 = auVar118._40_8_;
      uStack_1918 = uStack_27d8;
      uStack_27d0 = auVar118._48_8_;
      uStack_1910 = uStack_27d0;
      uStack_27c8 = auVar118._56_8_;
      uStack_1908 = uStack_27c8;
      auVar61._8_4_ = 0.5;
      auVar61._12_4_ = 0.5;
      auVar61._0_4_ = 0.5;
      auVar61._4_4_ = 0.5;
      auVar61._16_4_ = 0.5;
      auVar61._20_4_ = 0.5;
      auVar61._24_4_ = 0.5;
      auVar61._28_4_ = 0.5;
      auVar61._32_4_ = 0.5;
      auVar61._36_4_ = 0.5;
      auVar61._40_4_ = 0.5;
      auVar61._44_4_ = 0.5;
      auVar61._48_4_ = 0.5;
      auVar61._52_4_ = 0.5;
      auVar61._56_4_ = 0.5;
      auVar61._60_4_ = 0.5;
      auVar118 = vfnmadd213ps_avx512f(auVar61,local_27c0,auVar118);
      local_1840 = local_2600._0_8_;
      uStack_1838 = local_2600._8_8_;
      uStack_1830 = local_2600._16_8_;
      uStack_1828 = local_2600._24_8_;
      uStack_1820 = local_2600._32_8_;
      uStack_1818 = local_2600._40_8_;
      uStack_1810 = local_2600._48_8_;
      uStack_1808 = local_2600._56_8_;
      local_2800 = auVar118._0_8_;
      local_1880 = local_2800;
      uStack_27f8 = auVar118._8_8_;
      uStack_1878 = uStack_27f8;
      uStack_27f0 = auVar118._16_8_;
      uStack_1870 = uStack_27f0;
      uStack_27e8 = auVar118._24_8_;
      uStack_1868 = uStack_27e8;
      uStack_27e0 = auVar118._32_8_;
      uStack_1860 = uStack_27e0;
      uStack_27d8 = auVar118._40_8_;
      uStack_1858 = uStack_27d8;
      uStack_27d0 = auVar118._48_8_;
      uStack_1850 = uStack_27d0;
      uStack_27c8 = auVar118._56_8_;
      uStack_1848 = uStack_27c8;
      auVar62._16_8_ = local_2600._16_8_;
      auVar62._0_16_ = local_2600._0_16_;
      auVar62._24_8_ = local_2600._24_8_;
      auVar62._32_8_ = local_2600._32_8_;
      auVar62._40_8_ = local_2600._40_8_;
      auVar62._48_8_ = local_2600._48_8_;
      auVar62._56_8_ = local_2600._56_8_;
      auVar118 = vaddps_avx512f(auVar62,auVar118);
      local_21c0 = local_2700._0_8_;
      uStack_21b8 = local_2700._8_8_;
      uStack_21b0 = uStack_26f0;
      uStack_21a8 = uStack_26e8;
      uStack_21a0 = uStack_26e0;
      uStack_2198 = uStack_26d8;
      uStack_2190 = uStack_26d0;
      uStack_2188 = uStack_26c8;
      local_2200[0] = 0.6933594;
      local_2200[1] = 0.6933594;
      afStack_21f8[0] = 0.6933594;
      afStack_21f8[1] = 0.6933594;
      afStack_21f0[0] = 0.6933594;
      afStack_21f0[1] = 0.6933594;
      afStack_21e8[0] = 0.6933594;
      afStack_21e8[1] = 0.6933594;
      afStack_21e0[0] = 0.6933594;
      afStack_21e0[1] = 0.6933594;
      afStack_21d8[0] = 0.6933594;
      afStack_21d8[1] = 0.6933594;
      afStack_21d0[0] = 0.6933594;
      afStack_21d0[1] = 0.6933594;
      afStack_21c8[0] = 0.6933594;
      afStack_21c8[1] = 0.6933594;
      local_2600._0_8_ = auVar118._0_8_;
      local_2240 = local_2600._0_8_;
      local_2600._8_8_ = auVar118._8_8_;
      uStack_2238 = local_2600._8_8_;
      local_2600._16_8_ = auVar118._16_8_;
      uStack_2230 = local_2600._16_8_;
      local_2600._24_8_ = auVar118._24_8_;
      uStack_2228 = local_2600._24_8_;
      local_2600._32_8_ = auVar118._32_8_;
      uStack_2220 = local_2600._32_8_;
      local_2600._40_8_ = auVar118._40_8_;
      uStack_2218 = local_2600._40_8_;
      local_2600._48_8_ = auVar118._48_8_;
      uStack_2210 = local_2600._48_8_;
      local_2600._56_8_ = auVar118._56_8_;
      uStack_2208 = local_2600._56_8_;
      auVar40._16_8_ = uStack_26f0;
      auVar40._0_16_ = local_2700;
      auVar40._24_8_ = uStack_26e8;
      auVar40._32_8_ = uStack_26e0;
      auVar40._40_8_ = uStack_26d8;
      auVar40._48_8_ = uStack_26d0;
      auVar40._56_8_ = uStack_26c8;
      auVar39._8_4_ = 0.6933594;
      auVar39._12_4_ = 0.6933594;
      auVar39._0_4_ = 0.6933594;
      auVar39._4_4_ = 0.6933594;
      auVar39._16_4_ = 0.6933594;
      auVar39._20_4_ = 0.6933594;
      auVar39._24_4_ = 0.6933594;
      auVar39._28_4_ = 0.6933594;
      auVar39._32_4_ = 0.6933594;
      auVar39._36_4_ = 0.6933594;
      auVar39._40_4_ = 0.6933594;
      auVar39._44_4_ = 0.6933594;
      auVar39._48_4_ = 0.6933594;
      auVar39._52_4_ = 0.6933594;
      auVar39._56_4_ = 0.6933594;
      auVar39._60_4_ = 0.6933594;
      local_2600 = vfmadd213ps_avx512f(auVar39,auVar40,auVar118);
      local_1680 = local_2600._0_8_;
      uStack_1678 = local_2600._8_8_;
      uStack_1670 = local_2600._16_8_;
      uStack_1668 = local_2600._24_8_;
      uStack_1660 = local_2600._32_8_;
      uStack_1658 = local_2600._40_8_;
      uStack_1650 = local_2600._48_8_;
      uStack_1648 = local_2600._56_8_;
      auVar118 = vpmovm2d_avx512dq(uVar20 & 0xffff);
      local_25c0 = vmovdqa64_avx512f(auVar118);
      auVar118 = vmovdqa64_avx512f(local_25c0);
      local_16c0 = vmovdqa64_avx512f(auVar118);
      auVar118 = vmovdqa64_avx512f(local_2600);
      auVar120 = vmovdqa64_avx512f(local_16c0);
      auVar118 = vpord_avx512f(auVar118,auVar120);
      local_2840 = vmovdqa64_avx512f(auVar118);
      local_12d4 = 0x3ede5bd9;
      local_1340 = vbroadcastss_avx512f(ZEXT416(0x3ede5bd9));
      local_2880 = local_1340._0_8_;
      uStack_2878 = local_1340._8_8_;
      uStack_2870 = local_1340._16_8_;
      uStack_2868 = local_1340._24_8_;
      uStack_2860 = local_1340._32_8_;
      uStack_2858 = local_1340._40_8_;
      uStack_2850 = local_1340._48_8_;
      uStack_2848 = local_1340._56_8_;
      local_2ac0 = vmulps_avx512f(local_2840,local_1340);
      local_2970 = local_2a30;
      local_29c0 = local_2ac0._0_8_;
      uStack_29b8 = local_2ac0._8_8_;
      uStack_29b0 = local_2ac0._16_8_;
      uStack_29a8 = local_2ac0._24_8_;
      uStack_29a0 = local_2ac0._32_8_;
      uStack_2998 = local_2ac0._40_8_;
      uStack_2990 = local_2ac0._48_8_;
      uStack_2988 = local_2ac0._56_8_;
      *local_2a30 = local_2ac0;
      local_2a30 = local_2a30 + 1;
      _local_2800 = local_2840;
      _local_2700 = auVar119;
      local_2300 = local_2340;
      uStack_22f8 = uStack_2338;
      uStack_22f0 = uStack_2330;
      uStack_22e8 = uStack_2328;
      uStack_22e0 = uStack_2320;
      uStack_22d8 = uStack_2318;
      uStack_22d0 = uStack_2310;
      uStack_22c8 = uStack_2308;
      local_1a02 = local_2702;
      local_1a00 = local_1a80;
      uStack_19f8 = uStack_1a78;
      uStack_19f0 = uStack_1a70;
      uStack_19e8 = uStack_1a68;
      uStack_19e0 = uStack_1a60;
      uStack_19d8 = uStack_1a58;
      uStack_19d0 = uStack_1a50;
      uStack_19c8 = uStack_1a48;
      local_1442 = local_2702;
      local_1440 = local_14c0;
      uStack_1438 = uStack_14b8;
      uStack_1430 = uStack_14b0;
      uStack_1428 = uStack_14a8;
      uStack_1420 = uStack_14a0;
      uStack_1418 = uStack_1498;
      uStack_1410 = uStack_1490;
      uStack_1408 = uStack_1488;
      local_1342 = local_2682;
    }
    for (; uStack_2ac8 = uVar21, uVar117 = uStack_2ac8._4_4_, fVar116 = uStack_2ad0._4_4_,
        fVar115 = uStack_2ad8._4_4_, fVar121 = local_2ae0._4_4_, local_2a7c + 7 < local_2a24;
        local_2a7c = local_2a7c + 8) {
      local_2968 = local_2a30;
      uStack_f08 = *(undefined8 *)(*local_2a30 + 0x18);
      uStack_2ad8._4_4_ = (float)((ulong)*(undefined8 *)(*local_2a30 + 8) >> 0x20);
      uStack_2ad0._0_4_ = (undefined4)*(undefined8 *)(*local_2a30 + 0x10);
      uStack_2ad0._4_4_ = (float)((ulong)*(undefined8 *)(*local_2a30 + 0x10) >> 0x20);
      uStack_2ac8._0_4_ = (undefined4)uStack_f08;
      uStack_2ac8._4_4_ = (undefined4)((ulong)uStack_f08 >> 0x20);
      local_12c8 = local_2a09;
      local_12d0 = &local_2ae0;
      auVar22._12_4_ = uStack_2ad8._4_4_;
      auVar22._0_12_ = *(undefined1 (*) [12])*local_2a30;
      auVar101._16_4_ = (undefined4)uStack_2ad0;
      auVar101._0_16_ = auVar22;
      auVar101._20_4_ = uStack_2ad0._4_4_;
      auVar103._12_4_ = uStack_2ad8._4_4_;
      auVar103._0_12_ = *(undefined1 (*) [12])*local_2a30;
      auVar103._16_4_ = (undefined4)uStack_2ad0;
      auVar103._20_4_ = uStack_2ad0._4_4_;
      auVar103._24_4_ = (undefined4)uStack_2ac8;
      auVar103._28_4_ = uStack_2ac8._4_4_;
      auVar102._12_4_ = uStack_2ad8._4_4_;
      auVar102._0_12_ = *(undefined1 (*) [12])*local_2a30;
      auVar102._16_4_ = (undefined4)uStack_2ad0;
      auVar102._20_4_ = uStack_2ad0._4_4_;
      auVar102._24_4_ = (undefined4)uStack_2ac8;
      auVar102._28_4_ = uStack_2ac8._4_4_;
      local_11c0 = 0x3f800000;
      uStack_11bc = 0x3f800000;
      uStack_11b8 = 0x3f800000;
      uStack_11b4 = 0x3f800000;
      uStack_11b0 = 0x3f800000;
      uStack_11ac = 0x3f800000;
      uStack_11a8 = 0x3f800000;
      uStack_11a4 = 0x3f800000;
      local_1020 = 0;
      uStack_1018 = 0;
      uStack_1010 = 0;
      uStack_1008 = 0;
      local_11e0 = vcmpps_avx(auVar102,ZEXT1632(ZEXT816(0)),2);
      local_1180 = SUB128(*(undefined1 (*) [12])*local_2a30,0);
      local_f20 = local_1180;
      uStack_1178 = auVar22._8_8_;
      uStack_f18 = uStack_1178;
      uStack_1170 = auVar101._16_8_;
      uStack_f10 = uStack_1170;
      local_f40 = 0x800000;
      uStack_f3c = 0x800000;
      uStack_f38 = 0x800000;
      uStack_f34 = 0x800000;
      uStack_f30 = 0x800000;
      uStack_f2c = 0x800000;
      uStack_f28 = 0x800000;
      uStack_f24 = 0x800000;
      auVar67._8_4_ = 0x800000;
      auVar67._0_8_ = 0x80000000800000;
      auVar67._12_4_ = 0x800000;
      auVar67._16_4_ = 0x800000;
      auVar67._20_4_ = 0x800000;
      auVar67._24_4_ = 0x800000;
      auVar67._28_4_ = 0x800000;
      auVar17 = vmaxps_avx(auVar103,auVar67);
      local_1180 = auVar17._0_8_;
      local_8c0 = local_1180;
      uStack_1178 = auVar17._8_8_;
      uStack_8b8 = uStack_1178;
      uStack_1170 = auVar17._16_8_;
      uStack_8b0 = uStack_1170;
      uStack_1168 = auVar17._24_8_;
      uStack_8a8 = uStack_1168;
      local_8e0 = local_1180;
      uStack_8d8 = uStack_1178;
      uStack_8d0 = uStack_1170;
      uStack_8c8 = uStack_1168;
      local_8e4 = 0x17;
      local_7a0 = local_1180;
      uStack_798 = uStack_1178;
      uStack_790 = uStack_1170;
      uStack_788 = uStack_1168;
      local_7a4 = 0x17;
      auVar19 = vpsrld_avx2(auVar17,ZEXT416(0x17));
      local_10c0 = local_1180;
      uStack_10b8 = uStack_1178;
      uStack_10b0 = uStack_1170;
      uStack_10a8 = uStack_1168;
      local_10e0 = 0x807fffff;
      uStack_10dc = 0x807fffff;
      uStack_10d8 = 0x807fffff;
      uStack_10d4 = 0x807fffff;
      uStack_10d0 = 0x807fffff;
      uStack_10cc = 0x807fffff;
      uStack_10c8 = 0x807fffff;
      uStack_10c4 = 0x807fffff;
      auVar65._8_4_ = 0x807fffff;
      auVar65._0_8_ = 0x807fffff807fffff;
      auVar65._12_4_ = 0x807fffff;
      auVar65._16_4_ = 0x807fffff;
      auVar65._20_4_ = 0x807fffff;
      auVar65._24_4_ = 0x807fffff;
      auVar65._28_4_ = 0x807fffff;
      auVar17 = vpand_avx2(auVar17,auVar65);
      local_1180 = auVar17._0_8_;
      local_840 = local_1180;
      uStack_1178 = auVar17._8_8_;
      uStack_838 = uStack_1178;
      uStack_1170 = auVar17._16_8_;
      uStack_830 = uStack_1170;
      uStack_1168 = auVar17._24_8_;
      uStack_828 = uStack_1168;
      local_860 = 0x3f000000;
      uStack_85c = 0x3f000000;
      uStack_858 = 0x3f000000;
      uStack_854 = 0x3f000000;
      uStack_850 = 0x3f000000;
      uStack_84c = 0x3f000000;
      uStack_848 = 0x3f000000;
      uStack_844 = 0x3f000000;
      auVar79._8_4_ = 0x3f000000;
      auVar79._0_8_ = 0x3f0000003f000000;
      auVar79._12_4_ = 0x3f000000;
      auVar79._16_4_ = 0x3f000000;
      auVar79._20_4_ = 0x3f000000;
      auVar79._24_4_ = 0x3f000000;
      auVar79._28_4_ = 0x3f000000;
      auVar18 = vpor_avx2(auVar17,auVar79);
      local_11a0._0_8_ = auVar19._0_8_;
      local_800 = local_11a0._0_8_;
      local_11a0._8_8_ = auVar19._8_8_;
      uStack_7f8 = local_11a0._8_8_;
      local_11a0._16_8_ = auVar19._16_8_;
      uStack_7f0 = local_11a0._16_8_;
      local_11a0._24_8_ = auVar19._24_8_;
      uStack_7e8 = local_11a0._24_8_;
      local_820 = 0x7f0000007f;
      uStack_818 = 0x7f0000007f;
      uStack_810 = 0x7f0000007f;
      uStack_808 = 0x7f0000007f;
      local_760 = local_11a0._0_8_;
      uStack_758 = local_11a0._8_8_;
      uStack_750 = local_11a0._16_8_;
      uStack_748 = local_11a0._24_8_;
      local_780 = 0x7f0000007f;
      uStack_778 = 0x7f0000007f;
      uStack_770 = 0x7f0000007f;
      uStack_768 = 0x7f0000007f;
      auVar80._8_8_ = 0x7f0000007f;
      auVar80._0_8_ = 0x7f0000007f;
      auVar80._16_8_ = 0x7f0000007f;
      auVar80._24_8_ = 0x7f0000007f;
      local_11a0 = vpsubd_avx2(auVar19,auVar80);
      local_7e0 = local_11a0._0_8_;
      uStack_7d8 = local_11a0._8_8_;
      uStack_7d0 = local_11a0._16_8_;
      uStack_7c8 = local_11a0._24_8_;
      auVar17 = vcvtdq2ps_avx(local_11a0);
      local_1200 = auVar17._0_8_;
      uVar24 = local_1200;
      uStack_11f8 = auVar17._8_8_;
      uVar25 = uStack_11f8;
      uStack_11f0 = auVar17._16_8_;
      uVar26 = uStack_11f0;
      uStack_11e8 = auVar17._24_8_;
      uVar27 = uStack_11e8;
      local_d60 = 0x3f8000003f800000;
      uStack_d58 = 0x3f8000003f800000;
      uStack_d50 = 0x3f8000003f800000;
      uStack_d48 = 0x3f8000003f800000;
      local_d40._0_4_ = auVar17._0_4_;
      local_d40._4_4_ = auVar17._4_4_;
      uStack_d38._0_4_ = auVar17._8_4_;
      uStack_d38._4_4_ = auVar17._12_4_;
      uStack_d30._0_4_ = auVar17._16_4_;
      uStack_d30._4_4_ = auVar17._20_4_;
      uStack_d28._0_4_ = auVar17._24_4_;
      uStack_d28._4_4_ = auVar17._28_4_;
      local_1200._4_4_ = local_d40._4_4_ + 1.0;
      local_1200._0_4_ = (float)local_d40 + 1.0;
      uStack_11f8._0_4_ = (float)uStack_d38 + 1.0;
      uStack_11f8._4_4_ = uStack_d38._4_4_ + 1.0;
      uStack_11f0._0_4_ = (float)uStack_d30 + 1.0;
      uStack_11f0._4_4_ = uStack_d30._4_4_ + 1.0;
      auVar101 = _local_1200;
      uStack_11e8._0_4_ = (float)uStack_d28 + 1.0;
      uStack_11e8._4_4_ = uStack_d28._4_4_ + 1.0;
      auVar19 = _local_1200;
      auVar123._8_4_ = 0x3f3504f3;
      auVar123._0_8_ = 0x3f3504f33f3504f3;
      auVar123._12_4_ = 0x3f3504f3;
      auVar123._16_4_ = 0x3f3504f3;
      auVar123._20_4_ = 0x3f3504f3;
      auVar123._24_4_ = 0x3f3504f3;
      auVar123._28_4_ = 0x3f3504f3;
      local_1220 = vcmpps_avx(auVar18,auVar123,1);
      local_1180 = auVar18._0_8_;
      local_1100 = local_1180;
      uStack_1178 = auVar18._8_8_;
      uStack_10f8 = uStack_1178;
      uStack_1170 = auVar18._16_8_;
      uStack_10f0 = uStack_1170;
      uStack_1168 = auVar18._24_8_;
      uStack_10e8 = uStack_1168;
      local_1120 = local_1220._0_8_;
      uStack_1118 = local_1220._8_8_;
      uStack_1110 = local_1220._16_8_;
      uStack_1108 = local_1220._24_8_;
      local_1240 = vpand_avx2(auVar18,local_1220);
      local_1040 = local_1180;
      uStack_1038 = uStack_1178;
      uStack_1030 = uStack_1170;
      uStack_1028 = uStack_1168;
      local_1060 = 0x3f8000003f800000;
      uStack_1058 = 0x3f8000003f800000;
      uStack_1050 = 0x3f8000003f800000;
      uStack_1048 = 0x3f8000003f800000;
      auVar66._8_8_ = 0x3f8000003f800000;
      auVar66._0_8_ = 0x3f8000003f800000;
      auVar66._16_8_ = 0x3f8000003f800000;
      auVar66._24_8_ = 0x3f8000003f800000;
      auVar17 = vsubps_avx(auVar18,auVar66);
      local_1080 = local_1200;
      uStack_1078 = uStack_11f8;
      uStack_11f0 = auVar101._16_8_;
      uStack_1070 = uStack_11f0;
      uStack_11e8 = auVar19._24_8_;
      uStack_1068 = uStack_11e8;
      local_1140 = 0x3f8000003f800000;
      uStack_1138 = 0x3f8000003f800000;
      uStack_1130 = 0x3f8000003f800000;
      uStack_1128 = 0x3f8000003f800000;
      local_1160 = local_1220._0_8_;
      uStack_1158 = local_1220._8_8_;
      uStack_1150 = local_1220._16_8_;
      uStack_1148 = local_1220._24_8_;
      auVar18._8_8_ = 0x3f8000003f800000;
      auVar18._0_8_ = 0x3f8000003f800000;
      auVar18._16_8_ = 0x3f8000003f800000;
      auVar18._24_8_ = 0x3f8000003f800000;
      local_10a0 = vpand_avx2(auVar18,local_1220);
      auVar19._16_8_ = uStack_11f0;
      auVar19._0_16_ = _local_1200;
      auVar19._24_8_ = uStack_11e8;
      _local_1200 = vsubps_avx(auVar19,local_10a0);
      local_1180 = auVar17._0_8_;
      uVar28 = local_1180;
      uStack_1178 = auVar17._8_8_;
      uVar29 = uStack_1178;
      uStack_1170 = auVar17._16_8_;
      uVar30 = uStack_1170;
      uStack_1168 = auVar17._24_8_;
      uVar31 = uStack_1168;
      local_d80._0_4_ = auVar17._0_4_;
      local_d80._4_4_ = auVar17._4_4_;
      uStack_d78._0_4_ = auVar17._8_4_;
      uStack_d78._4_4_ = auVar17._12_4_;
      uStack_d70._0_4_ = auVar17._16_4_;
      uStack_d70._4_4_ = auVar17._20_4_;
      uStack_d68._0_4_ = auVar17._24_4_;
      uStack_d68._4_4_ = auVar17._28_4_;
      local_da0._0_4_ = local_1240._0_4_;
      local_da0._4_4_ = local_1240._4_4_;
      uStack_d98._0_4_ = local_1240._8_4_;
      uStack_d98._4_4_ = local_1240._12_4_;
      uStack_d90._0_4_ = local_1240._16_4_;
      uStack_d90._4_4_ = local_1240._20_4_;
      uStack_d88._0_4_ = local_1240._24_4_;
      uStack_d88._4_4_ = local_1240._28_4_;
      local_1180._0_4_ = (float)local_d80 + (float)local_da0;
      local_1180._4_4_ = local_d80._4_4_ + local_da0._4_4_;
      uStack_d78._0_4_ = (float)uStack_d78 + (float)uStack_d98;
      uStack_d78._4_4_ = uStack_d78._4_4_ + uStack_d98._4_4_;
      uStack_d70._0_4_ = (float)uStack_d70 + (float)uStack_d90;
      uStack_d70._4_4_ = uStack_d70._4_4_ + uStack_d90._4_4_;
      uStack_d68._0_4_ = (float)uStack_d68 + (float)uStack_d88;
      fStack_1244 = uStack_d68._4_4_ + uStack_d88._4_4_;
      uStack_1178._0_4_ = (float)uStack_d78;
      uStack_1178._4_4_ = uStack_d78._4_4_;
      uStack_1170._0_4_ = (float)uStack_d70;
      uStack_1170._4_4_ = uStack_d70._4_4_;
      auVar101 = _local_1180;
      uStack_1168._0_4_ = (float)uStack_d68;
      uStack_1168._4_4_ = fStack_1244;
      auVar18 = _local_1180;
      local_f80 = local_1180;
      uStack_f78 = uStack_1178;
      uStack_1170 = auVar101._16_8_;
      uStack_f70 = uStack_1170;
      uStack_1168 = auVar18._24_8_;
      uStack_f68 = uStack_1168;
      local_1260 = (float)local_1180._0_4_ * (float)local_1180._0_4_;
      fStack_125c = (float)local_1180._4_4_ * (float)local_1180._4_4_;
      fStack_1258 = (float)uStack_d78 * (float)uStack_d78;
      fStack_1254 = uStack_d78._4_4_ * uStack_d78._4_4_;
      fStack_1250 = (float)uStack_d70 * (float)uStack_d70;
      fStack_124c = uStack_d70._4_4_ * uStack_d70._4_4_;
      fStack_1248 = (float)uStack_d68 * (float)uStack_d68;
      uStack_1278._0_4_ = 0x3d9021bb;
      local_1280 = (undefined1  [8])0x3d9021bb3d9021bb;
      uStack_1278._4_4_ = 0x3d9021bb;
      uStack_1270._0_4_ = 0x3d9021bb;
      uStack_1270._4_4_ = 0x3d9021bb;
      auVar101 = _local_1280;
      uStack_1268._0_4_ = 0.070376836;
      uStack_1268._4_4_ = 0x3d9021bb;
      auVar17 = _local_1280;
      local_ed0 = local_1280;
      local_ee8 = local_1180;
      local_e10 = ::_ps256_cephes_log_p1;
      local_ce0 = 0x3d9021bb3d9021bb;
      uStack_cd8 = uStack_1278;
      uStack_1270 = auVar101._16_8_;
      uStack_cd0 = uStack_1270;
      uStack_1268 = auVar17._24_8_;
      uStack_cc8 = uStack_1268;
      local_d00 = local_1180;
      uStack_cf8 = uStack_1178;
      uStack_cf0 = uStack_1170;
      uStack_ce8 = uStack_1168;
      local_d20[0] = -0.1151461;
      local_d20[1] = -0.1151461;
      afStack_d18[0] = -0.1151461;
      afStack_d18[1] = -0.1151461;
      afStack_d10[0] = -0.1151461;
      afStack_d10[1] = -0.1151461;
      afStack_d08[0] = -0.1151461;
      afStack_d08[1] = -0.1151461;
      auVar68._8_4_ = -0.1151461;
      auVar68._12_4_ = -0.1151461;
      auVar68._0_4_ = -0.1151461;
      auVar68._4_4_ = -0.1151461;
      auVar68._16_4_ = -0.1151461;
      auVar68._20_4_ = -0.1151461;
      auVar68._24_4_ = -0.1151461;
      auVar68._28_4_ = -0.1151461;
      auVar22 = vfmadd213ps_fma(auVar18,auVar17,auVar68);
      local_e28 = ::_ps256_cephes_log_p2;
      local_1280 = auVar22._0_8_;
      local_c80 = local_1280;
      uStack_1278 = auVar22._8_8_;
      uStack_c78 = uStack_1278;
      uStack_c70 = 0;
      uStack_c68 = 0;
      local_ca0 = local_1180;
      uStack_c98 = uStack_1178;
      uStack_c90 = uStack_1170;
      uStack_c88 = uStack_1168;
      local_cc0[0] = 0.116769984;
      local_cc0[1] = 0.116769984;
      afStack_cb8[0] = 0.116769984;
      afStack_cb8[1] = 0.116769984;
      afStack_cb0[0] = 0.116769984;
      afStack_cb0[1] = 0.116769984;
      afStack_ca8[0] = 0.116769984;
      afStack_ca8[1] = 0.116769984;
      auVar69._8_4_ = 0.116769984;
      auVar69._12_4_ = 0.116769984;
      auVar69._0_4_ = 0.116769984;
      auVar69._4_4_ = 0.116769984;
      auVar69._16_4_ = 0.116769984;
      auVar69._20_4_ = 0.116769984;
      auVar69._24_4_ = 0.116769984;
      auVar69._28_4_ = 0.116769984;
      auVar22 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar22),auVar69);
      local_e40 = ::_ps256_cephes_log_p3;
      local_1280 = auVar22._0_8_;
      local_c20 = local_1280;
      uStack_1278 = auVar22._8_8_;
      uStack_c18 = uStack_1278;
      uStack_c10 = 0;
      uStack_c08 = 0;
      local_c40 = local_1180;
      uStack_c38 = uStack_1178;
      uStack_c30 = uStack_1170;
      uStack_c28 = uStack_1168;
      local_c60[0] = -0.12420141;
      local_c60[1] = -0.12420141;
      afStack_c58[0] = -0.12420141;
      afStack_c58[1] = -0.12420141;
      afStack_c50[0] = -0.12420141;
      afStack_c50[1] = -0.12420141;
      afStack_c48[0] = -0.12420141;
      afStack_c48[1] = -0.12420141;
      auVar70._8_4_ = -0.12420141;
      auVar70._12_4_ = -0.12420141;
      auVar70._0_4_ = -0.12420141;
      auVar70._4_4_ = -0.12420141;
      auVar70._16_4_ = -0.12420141;
      auVar70._20_4_ = -0.12420141;
      auVar70._24_4_ = -0.12420141;
      auVar70._28_4_ = -0.12420141;
      auVar22 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar22),auVar70);
      local_e58 = ::_ps256_cephes_log_p4;
      local_1280 = auVar22._0_8_;
      local_bc0 = local_1280;
      uStack_1278 = auVar22._8_8_;
      uStack_bb8 = uStack_1278;
      uStack_bb0 = 0;
      uStack_ba8 = 0;
      local_be0 = local_1180;
      uStack_bd8 = uStack_1178;
      uStack_bd0 = uStack_1170;
      uStack_bc8 = uStack_1168;
      local_c00[0] = 0.14249323;
      local_c00[1] = 0.14249323;
      afStack_bf8[0] = 0.14249323;
      afStack_bf8[1] = 0.14249323;
      afStack_bf0[0] = 0.14249323;
      afStack_bf0[1] = 0.14249323;
      afStack_be8[0] = 0.14249323;
      afStack_be8[1] = 0.14249323;
      auVar71._8_4_ = 0.14249323;
      auVar71._12_4_ = 0.14249323;
      auVar71._0_4_ = 0.14249323;
      auVar71._4_4_ = 0.14249323;
      auVar71._16_4_ = 0.14249323;
      auVar71._20_4_ = 0.14249323;
      auVar71._24_4_ = 0.14249323;
      auVar71._28_4_ = 0.14249323;
      auVar22 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar22),auVar71);
      local_e70 = ::_ps256_cephes_log_p5;
      local_1280 = auVar22._0_8_;
      local_b60 = local_1280;
      uStack_1278 = auVar22._8_8_;
      uStack_b58 = uStack_1278;
      uStack_b50 = 0;
      uStack_b48 = 0;
      local_b80 = local_1180;
      uStack_b78 = uStack_1178;
      uStack_b70 = uStack_1170;
      uStack_b68 = uStack_1168;
      local_ba0[0] = -0.16668057;
      local_ba0[1] = -0.16668057;
      afStack_b98[0] = -0.16668057;
      afStack_b98[1] = -0.16668057;
      afStack_b90[0] = -0.16668057;
      afStack_b90[1] = -0.16668057;
      afStack_b88[0] = -0.16668057;
      afStack_b88[1] = -0.16668057;
      auVar72._8_4_ = -0.16668057;
      auVar72._12_4_ = -0.16668057;
      auVar72._0_4_ = -0.16668057;
      auVar72._4_4_ = -0.16668057;
      auVar72._16_4_ = -0.16668057;
      auVar72._20_4_ = -0.16668057;
      auVar72._24_4_ = -0.16668057;
      auVar72._28_4_ = -0.16668057;
      auVar22 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar22),auVar72);
      local_e88 = ::_ps256_cephes_log_p6;
      local_1280 = auVar22._0_8_;
      local_b00 = local_1280;
      uStack_1278 = auVar22._8_8_;
      uStack_af8 = uStack_1278;
      uStack_af0 = 0;
      uStack_ae8 = 0;
      local_b20 = local_1180;
      uStack_b18 = uStack_1178;
      uStack_b10 = uStack_1170;
      uStack_b08 = uStack_1168;
      local_b40[0] = 0.20000714;
      local_b40[1] = 0.20000714;
      afStack_b38[0] = 0.20000714;
      afStack_b38[1] = 0.20000714;
      afStack_b30[0] = 0.20000714;
      afStack_b30[1] = 0.20000714;
      afStack_b28[0] = 0.20000714;
      afStack_b28[1] = 0.20000714;
      auVar73._8_4_ = 0.20000714;
      auVar73._12_4_ = 0.20000714;
      auVar73._0_4_ = 0.20000714;
      auVar73._4_4_ = 0.20000714;
      auVar73._16_4_ = 0.20000714;
      auVar73._20_4_ = 0.20000714;
      auVar73._24_4_ = 0.20000714;
      auVar73._28_4_ = 0.20000714;
      auVar22 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar22),auVar73);
      local_ea0 = ::_ps256_cephes_log_p7;
      local_1280 = auVar22._0_8_;
      local_aa0 = local_1280;
      uStack_1278 = auVar22._8_8_;
      uStack_a98 = uStack_1278;
      uStack_a90 = 0;
      uStack_a88 = 0;
      local_ac0 = local_1180;
      uStack_ab8 = uStack_1178;
      uStack_ab0 = uStack_1170;
      uStack_aa8 = uStack_1168;
      local_ae0[0] = -0.24999994;
      local_ae0[1] = -0.24999994;
      afStack_ad8[0] = -0.24999994;
      afStack_ad8[1] = -0.24999994;
      afStack_ad0[0] = -0.24999994;
      afStack_ad0[1] = -0.24999994;
      afStack_ac8[0] = -0.24999994;
      afStack_ac8[1] = -0.24999994;
      auVar74._8_4_ = -0.24999994;
      auVar74._12_4_ = -0.24999994;
      auVar74._0_4_ = -0.24999994;
      auVar74._4_4_ = -0.24999994;
      auVar74._16_4_ = -0.24999994;
      auVar74._20_4_ = -0.24999994;
      auVar74._24_4_ = -0.24999994;
      auVar74._28_4_ = -0.24999994;
      auVar22 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar22),auVar74);
      local_eb8 = ::_ps256_cephes_log_p8;
      local_1280 = auVar22._0_8_;
      local_a40 = local_1280;
      uStack_1278 = auVar22._8_8_;
      uStack_a38 = uStack_1278;
      uStack_a30 = 0;
      uStack_a28 = 0;
      local_a60 = local_1180;
      uStack_a58 = uStack_1178;
      uStack_a50 = uStack_1170;
      uStack_a48 = uStack_1168;
      local_a80[0] = 0.3333333;
      local_a80[1] = 0.3333333;
      afStack_a78[0] = 0.3333333;
      afStack_a78[1] = 0.3333333;
      afStack_a70[0] = 0.3333333;
      afStack_a70[1] = 0.3333333;
      afStack_a68[0] = 0.3333333;
      afStack_a68[1] = 0.3333333;
      auVar75._8_4_ = 0.3333333;
      auVar75._12_4_ = 0.3333333;
      auVar75._0_4_ = 0.3333333;
      auVar75._4_4_ = 0.3333333;
      auVar75._16_4_ = 0.3333333;
      auVar75._20_4_ = 0.3333333;
      auVar75._24_4_ = 0.3333333;
      auVar75._28_4_ = 0.3333333;
      auVar22 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar22),auVar75);
      local_1280 = auVar22._0_8_;
      uVar32 = local_1280;
      uStack_1278 = auVar22._8_8_;
      uVar33 = uStack_1278;
      uStack_f90 = 0;
      uStack_f88 = 0;
      local_fc0 = local_1180;
      uStack_fb8 = uStack_1178;
      uStack_fb0 = uStack_1170;
      uStack_fa8 = uStack_1168;
      local_fa0._0_4_ = auVar22._0_4_;
      local_fa0._4_4_ = auVar22._4_4_;
      uStack_f98._0_4_ = auVar22._8_4_;
      uStack_f98._4_4_ = auVar22._12_4_;
      local_1280._4_4_ = local_fa0._4_4_ * (float)local_1180._4_4_;
      local_1280._0_4_ = (float)local_fa0 * (float)local_1180._0_4_;
      uStack_1278._0_4_ = (float)uStack_f98 * (float)uStack_d78;
      uStack_1278._4_4_ = uStack_f98._4_4_ * uStack_d78._4_4_;
      uStack_1270._0_4_ = (float)uStack_d70 * 0.0;
      uStack_1270._4_4_ = uStack_d70._4_4_ * 0.0;
      auVar101 = _local_1280;
      local_fe0 = local_1280;
      uStack_fd8 = uStack_1278;
      uStack_1270 = auVar101._16_8_;
      uStack_fd0 = uStack_1270;
      uStack_1268 = (ulong)(uint)((float)uStack_d68 * 0.0);
      uStack_fc8 = uStack_1268;
      local_1000 = CONCAT44(fStack_125c,local_1260);
      uStack_ff8 = CONCAT44(fStack_1254,fStack_1258);
      uStack_ff0 = CONCAT44(fStack_124c,fStack_1250);
      uStack_fe8 = CONCAT44(fStack_1244,fStack_1248);
      uStack_1268._0_4_ = (float)uStack_d68 * 0.0 * fStack_1248;
      local_1280._4_4_ = local_fa0._4_4_ * (float)local_1180._4_4_ * fStack_125c;
      local_1280._0_4_ = (float)local_fa0 * (float)local_1180._0_4_ * local_1260;
      uStack_1278._0_4_ = (float)uStack_f98 * (float)uStack_d78 * fStack_1258;
      uStack_1278._4_4_ = uStack_f98._4_4_ * uStack_d78._4_4_ * fStack_1254;
      uStack_1270._0_4_ = (float)uStack_d70 * 0.0 * fStack_1250;
      uStack_1270._4_4_ = uStack_d70._4_4_ * 0.0 * fStack_124c;
      auVar101 = _local_1280;
      uStack_1268._4_4_ = 0;
      auVar17 = _local_1280;
      local_ed8 = local_1200;
      local_ec8 = ::_ps256_cephes_log_q1;
      local_9e0 = local_1200;
      uStack_9d8 = uStack_11f8;
      uStack_9d0 = uStack_11f0;
      uStack_9c8 = uStack_11e8;
      local_a00[0] = -0.00021219444;
      local_a00[1] = -0.00021219444;
      afStack_9f8[0] = -0.00021219444;
      afStack_9f8[1] = -0.00021219444;
      afStack_9f0[0] = -0.00021219444;
      afStack_9f0[1] = -0.00021219444;
      afStack_9e8[0] = -0.00021219444;
      afStack_9e8[1] = -0.00021219444;
      local_a20 = local_1280;
      uStack_a18 = uStack_1278;
      uStack_1270 = auVar101._16_8_;
      uStack_a10 = uStack_1270;
      uStack_1268 = (ulong)(uint)(float)uStack_1268;
      uStack_a08 = uStack_1268;
      auVar76._8_4_ = -0.00021219444;
      auVar76._12_4_ = -0.00021219444;
      auVar76._0_4_ = -0.00021219444;
      auVar76._4_4_ = -0.00021219444;
      auVar76._16_4_ = -0.00021219444;
      auVar76._20_4_ = -0.00021219444;
      auVar76._24_4_ = -0.00021219444;
      auVar76._28_4_ = -0.00021219444;
      auVar22 = vfmadd213ps_fma(auVar76,_local_1200,auVar17);
      local_de8 = &local_1260;
      local_df0 = ::_ps256_0p5;
      local_920 = CONCAT44(fStack_125c,local_1260);
      uStack_918 = CONCAT44(fStack_1254,fStack_1258);
      uStack_910 = CONCAT44(fStack_124c,fStack_1250);
      uStack_908 = CONCAT44(fStack_1244,fStack_1248);
      auVar104._4_4_ = fStack_125c;
      auVar104._0_4_ = local_1260;
      auVar104._8_4_ = fStack_1258;
      auVar104._12_4_ = fStack_1254;
      auVar104._16_4_ = fStack_1250;
      auVar104._20_4_ = fStack_124c;
      auVar104._24_4_ = fStack_1248;
      auVar104._28_4_ = fStack_1244;
      local_940[0] = 0.5;
      local_940[1] = 0.5;
      afStack_938[0] = 0.5;
      afStack_938[1] = 0.5;
      afStack_930[0] = 0.5;
      afStack_930[1] = 0.5;
      afStack_928[0] = 0.5;
      afStack_928[1] = 0.5;
      local_1280 = auVar22._0_8_;
      local_960 = local_1280;
      uStack_1278 = auVar22._8_8_;
      uStack_958 = uStack_1278;
      uStack_950 = 0;
      uStack_948 = 0;
      auVar78._8_4_ = 0.5;
      auVar78._12_4_ = 0.5;
      auVar78._0_4_ = 0.5;
      auVar78._4_4_ = 0.5;
      auVar78._16_4_ = 0.5;
      auVar78._20_4_ = 0.5;
      auVar78._24_4_ = 0.5;
      auVar78._28_4_ = 0.5;
      auVar22 = vfnmadd213ps_fma(auVar78,auVar104,ZEXT1632(auVar22));
      local_dc0 = local_1180;
      uStack_db8 = uStack_1178;
      uStack_db0 = uStack_1170;
      uStack_da8 = uStack_1168;
      local_1280 = auVar22._0_8_;
      uVar34 = local_1280;
      uStack_1278 = auVar22._8_8_;
      uVar35 = uStack_1278;
      uStack_dd0 = 0;
      uStack_dc8 = 0;
      local_de0._0_4_ = auVar22._0_4_;
      local_de0._4_4_ = auVar22._4_4_;
      uStack_dd8._0_4_ = auVar22._8_4_;
      uStack_dd8._4_4_ = auVar22._12_4_;
      local_1180._4_4_ = (float)local_1180._4_4_ + local_de0._4_4_;
      local_1180._0_4_ = (float)local_1180._0_4_ + (float)local_de0;
      uStack_1178._0_4_ = (float)uStack_d78 + (float)uStack_dd8;
      uStack_1178._4_4_ = uStack_d78._4_4_ + uStack_dd8._4_4_;
      uStack_1170._0_4_ = (float)uStack_d70 + 0.0;
      uStack_1170._4_4_ = uStack_d70._4_4_ + 0.0;
      auVar101 = _local_1180;
      uStack_1168._0_4_ = (float)uStack_d68 + 0.0;
      uStack_1168._4_4_ = fStack_1244 + 0.0;
      auVar17 = _local_1180;
      local_ee0 = ::_ps256_cephes_log_q2;
      local_980 = local_1200;
      uStack_978 = uStack_11f8;
      uStack_970 = uStack_11f0;
      uStack_968 = uStack_11e8;
      local_9a0[0] = 0.6933594;
      local_9a0[1] = 0.6933594;
      afStack_998[0] = 0.6933594;
      afStack_998[1] = 0.6933594;
      afStack_990[0] = 0.6933594;
      afStack_990[1] = 0.6933594;
      afStack_988[0] = 0.6933594;
      afStack_988[1] = 0.6933594;
      local_9c0 = local_1180;
      uStack_9b8 = uStack_1178;
      uStack_1170 = auVar101._16_8_;
      uStack_9b0 = uStack_1170;
      uStack_1168 = auVar17._24_8_;
      uStack_9a8 = uStack_1168;
      auVar77._8_4_ = 0.6933594;
      auVar77._12_4_ = 0.6933594;
      auVar77._0_4_ = 0.6933594;
      auVar77._4_4_ = 0.6933594;
      auVar77._16_4_ = 0.6933594;
      auVar77._20_4_ = 0.6933594;
      auVar77._24_4_ = 0.6933594;
      auVar77._28_4_ = 0.6933594;
      auVar23 = vfmadd213ps_fma(auVar77,_local_1200,auVar17);
      local_1180 = auVar23._0_8_;
      local_880 = local_1180;
      uStack_1178 = auVar23._8_8_;
      uStack_878 = uStack_1178;
      uStack_870 = 0;
      uStack_868 = 0;
      local_8a0 = local_11e0._0_8_;
      uStack_898 = local_11e0._8_8_;
      uStack_890 = local_11e0._16_8_;
      uStack_888 = local_11e0._24_8_;
      _local_12a0 = vpor_avx2(ZEXT1632(auVar23),local_11e0);
      local_724 = 0x3ede5bd9;
      local_6f0 = 0x3ede5bd9;
      auVar22 = vinsertps_avx(ZEXT416(0x3ede5bd9),ZEXT416(0x3ede5bd9),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3ede5bd9),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3ede5bd9),0x30);
      auVar16 = vinsertps_avx(ZEXT416(0x3ede5bd9),ZEXT416(0x3ede5bd9),0x10);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3ede5bd9),0x20);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3ede5bd9),0x30);
      auVar122._16_16_ = auVar22;
      auVar122._0_16_ = auVar16;
      local_720._0_8_ = auVar16._0_8_;
      local_720._8_8_ = auVar16._8_8_;
      local_720._16_8_ = auVar22._0_8_;
      local_720._24_8_ = auVar22._8_8_;
      local_12c0._0_4_ = auVar16._0_4_;
      local_12c0._4_4_ = auVar16._4_4_;
      uStack_12b8._0_4_ = auVar16._8_4_;
      uStack_12b8._4_4_ = auVar16._12_4_;
      uStack_12b0._0_4_ = auVar22._0_4_;
      uStack_12b0._4_4_ = auVar22._4_4_;
      uStack_12a8._0_4_ = auVar22._8_4_;
      local_2ae0._4_4_ = (float)local_12a0._4_4_ * local_12c0._4_4_;
      uStack_2ad8._4_4_ = fStack_1294 * uStack_12b8._4_4_;
      uStack_2ad0._4_4_ = fStack_128c * uStack_12b0._4_4_;
      local_2ae0 = CONCAT44(local_2ae0._4_4_,(float)local_12a0._0_4_ * (float)local_12c0);
      uStack_2ad8 = CONCAT44(uStack_2ad8._4_4_,fStack_1298 * (float)uStack_12b8);
      uStack_2ad0 = CONCAT44(uStack_2ad0._4_4_,fStack_1290 * (float)uStack_12b0);
      uStack_2948 = CONCAT44(uStack_1284,fStack_1288 * (float)uStack_12a8);
      uStack_2ac8._4_4_ = uStack_1284;
      local_2930 = local_2a30;
      auVar17._8_8_ = uStack_2ad8;
      auVar17._0_8_ = local_2ae0;
      auVar17._16_8_ = uStack_2ad0;
      auVar17._24_8_ = uStack_2948;
      *(undefined1 (*) [32])*local_2a30 = auVar17;
      local_2a30 = (undefined1 (*) [64])(*local_2a30 + 0x20);
      uVar21 = uStack_2948;
      local_2960 = local_2ae0;
      uStack_2958 = uStack_2ad8;
      uStack_2950 = uStack_2ad0;
      local_12c0 = local_720._0_8_;
      uStack_12b8 = local_720._8_8_;
      uStack_12b0 = local_720._16_8_;
      uStack_12a8 = local_720._24_8_;
      _local_1280 = _local_12a0;
      _local_1180 = ZEXT1632(auVar23);
      local_fa0 = uVar32;
      uStack_f98 = uVar33;
      local_f60 = local_f80;
      uStack_f58 = uStack_f78;
      uStack_f50 = uStack_f70;
      uStack_f48 = uStack_f68;
      local_ec0 = local_ed8;
      local_eb0 = local_ee8;
      local_ea8 = local_ed0;
      local_e98 = local_ee8;
      local_e90 = local_ed0;
      local_e80 = local_ee8;
      local_e78 = local_ed0;
      local_e68 = local_ee8;
      local_e60 = local_ed0;
      local_e50 = local_ee8;
      local_e48 = local_ed0;
      local_e38 = local_ee8;
      local_e30 = local_ed0;
      local_e20 = local_ee8;
      local_e18 = local_ed0;
      local_e08 = local_ee8;
      local_e00 = local_ed0;
      local_df8 = local_ed0;
      local_de0 = uVar34;
      uStack_dd8 = uVar35;
      local_da0 = local_1240._0_8_;
      uStack_d98 = local_1240._8_8_;
      uStack_d90 = local_1240._16_8_;
      uStack_d88 = local_1240._24_8_;
      local_d80 = uVar28;
      uStack_d78 = uVar29;
      uStack_d70 = uVar30;
      uStack_d68 = uVar31;
      local_d40 = uVar24;
      uStack_d38 = uVar25;
      uStack_d30 = uVar26;
      uStack_d28 = uVar27;
      local_720 = auVar122;
      local_6ec = local_6f0;
      local_6e8 = local_6f0;
      local_6e4 = local_6f0;
      local_6e0 = local_6f0;
      local_6dc = local_6f0;
      local_6d8 = local_6f0;
      local_6d4 = local_6f0;
    }
    for (; fVar107 = uStack_2ae8._4_4_, fVar106 = local_2af0._4_4_, uVar21 = local_2af0,
        uVar24 = uStack_2ae8, uVar25 = local_2ae0, uVar26 = uStack_2ad8, uVar27 = uStack_2ad0,
        uVar28 = uStack_2ac8, local_28b8 = local_29d0, local_2af0._4_4_ = fVar106,
        uStack_2ae8._4_4_ = fVar107, local_2a58 = local_2908, local_2a7c + 3 < local_2a24;
        local_2a7c = local_2a7c + 4) {
      local_2928 = local_2a30;
      local_4f0 = *(undefined8 *)*local_2a30;
      uStack_4e8 = *(undefined8 *)(*local_2a30 + 8);
      uStack_2ae8._4_4_ = (float)((ulong)uStack_4e8 >> 0x20);
      local_6c8 = local_2a09;
      local_6d0 = &local_2af0;
      auVar100._12_4_ = uStack_2ae8._4_4_;
      auVar100._0_12_ = *(undefined1 (*) [12])*local_2a30;
      auVar99._12_4_ = uStack_2ae8._4_4_;
      auVar99._0_12_ = *(undefined1 (*) [12])*local_2a30;
      local_640 = 0x3f800000;
      uStack_63c = 0x3f800000;
      uStack_638 = 0x3f800000;
      uStack_634 = 0x3f800000;
      local_570 = (undefined1  [16])0x0;
      local_150 = 0;
      uStack_148 = 0;
      local_650 = vcmpps_avx(auVar100,ZEXT816(0),2);
      local_500 = 0x800000;
      uStack_4fc = 0x800000;
      uStack_4f8 = 0x800000;
      uStack_4f4 = 0x800000;
      auVar84._8_4_ = 0x800000;
      auVar84._0_8_ = 0x80000000800000;
      auVar84._12_4_ = 0x800000;
      auVar22 = vmaxps_avx(auVar99,auVar84);
      local_620 = auVar22._0_8_;
      local_110 = local_620;
      uStack_618 = auVar22._8_8_;
      uStack_108 = uStack_618;
      local_120 = local_620;
      uStack_118 = uStack_618;
      local_124 = 0x17;
      auVar23 = vpsrld_avx(auVar22,ZEXT416(0x17));
      local_5c0 = local_620;
      uStack_5b8 = uStack_618;
      local_5d0 = 0x807fffff;
      uStack_5cc = 0x807fffff;
      uStack_5c8 = 0x807fffff;
      uStack_5c4 = 0x807fffff;
      auVar81._8_4_ = 0x807fffff;
      auVar81._0_8_ = 0x807fffff807fffff;
      auVar81._12_4_ = 0x807fffff;
      auVar22 = vpand_avx(auVar22,auVar81);
      local_620 = auVar22._0_8_;
      local_d0 = local_620;
      uStack_618 = auVar22._8_8_;
      uStack_c8 = uStack_618;
      local_e0 = 0x3f000000;
      uStack_dc = 0x3f000000;
      uStack_d8 = 0x3f000000;
      uStack_d4 = 0x3f000000;
      auVar96._8_4_ = 0x3f000000;
      auVar96._0_8_ = 0x3f0000003f000000;
      auVar96._12_4_ = 0x3f000000;
      auVar16 = vpor_avx(auVar22,auVar96);
      local_630._0_8_ = auVar23._0_8_;
      local_b0 = local_630._0_8_;
      local_630._8_8_ = auVar23._8_8_;
      uStack_a8 = local_630._8_8_;
      local_c0 = 0x7f0000007f;
      uStack_b8 = 0x7f0000007f;
      auVar97._8_8_ = 0x7f0000007f;
      auVar97._0_8_ = 0x7f0000007f;
      local_630 = vpsubd_avx(auVar23,auVar97);
      local_480 = local_630._0_8_;
      uStack_478 = local_630._8_8_;
      auVar22 = vcvtdq2ps_avx(local_630);
      local_660 = auVar22._0_8_;
      uVar21 = local_660;
      uStack_658 = auVar22._8_8_;
      uVar24 = uStack_658;
      local_4a0 = 0x3f8000003f800000;
      uStack_498 = 0x3f8000003f800000;
      local_490._0_4_ = auVar22._0_4_;
      local_490._4_4_ = auVar22._4_4_;
      uStack_488._0_4_ = auVar22._8_4_;
      uStack_488._4_4_ = auVar22._12_4_;
      local_660._4_4_ = local_490._4_4_ + 1.0;
      local_660._0_4_ = (float)local_490 + 1.0;
      uStack_658._0_4_ = (float)uStack_488 + 1.0;
      uStack_658._4_4_ = uStack_488._4_4_ + 1.0;
      local_620 = auVar16._0_8_;
      local_90 = local_620;
      uStack_618 = auVar16._8_8_;
      uStack_88 = uStack_618;
      local_a0 = 0x3f3504f3;
      uStack_9c = 0x3f3504f3;
      uStack_98 = 0x3f3504f3;
      uStack_94 = 0x3f3504f3;
      auVar98._8_4_ = 0x3f3504f3;
      auVar98._0_8_ = 0x3f3504f33f3504f3;
      auVar98._12_4_ = 0x3f3504f3;
      local_670 = vcmpps_avx(auVar16,auVar98,1);
      local_5e0 = local_620;
      uStack_5d8 = uStack_618;
      local_5f0 = local_670._0_8_;
      uStack_5e8 = local_670._8_8_;
      local_680 = vpand_avx(auVar16,local_670);
      local_580 = local_620;
      uStack_578 = uStack_618;
      local_590 = 0x3f8000003f800000;
      uStack_588 = 0x3f8000003f800000;
      auVar83._8_8_ = 0x3f8000003f800000;
      auVar83._0_8_ = 0x3f8000003f800000;
      auVar22 = vsubps_avx(auVar16,auVar83);
      local_5a0 = local_660;
      uStack_598 = uStack_658;
      local_600 = 0x3f8000003f800000;
      uStack_5f8 = 0x3f8000003f800000;
      local_610 = local_670._0_8_;
      uStack_608 = local_670._8_8_;
      auVar23._8_8_ = 0x3f8000003f800000;
      auVar23._0_8_ = 0x3f8000003f800000;
      local_5b0 = vpand_avx(auVar23,local_670);
      auVar82._8_8_ = uStack_658;
      auVar82._0_8_ = local_660;
      _local_660 = vsubps_avx(auVar82,local_5b0);
      local_620 = auVar22._0_8_;
      uVar25 = local_620;
      uStack_618 = auVar22._8_8_;
      uVar26 = uStack_618;
      local_4b0._0_4_ = auVar22._0_4_;
      local_4b0._4_4_ = auVar22._4_4_;
      uStack_4a8._0_4_ = auVar22._8_4_;
      uStack_4a8._4_4_ = auVar22._12_4_;
      local_4c0._0_4_ = local_680._0_4_;
      local_4c0._4_4_ = local_680._4_4_;
      uStack_4b8._0_4_ = local_680._8_4_;
      uStack_4b8._4_4_ = local_680._12_4_;
      local_620._0_4_ = (float)local_4b0 + (float)local_4c0;
      local_620._4_4_ = local_4b0._4_4_ + local_4c0._4_4_;
      uStack_4a8._0_4_ = (float)uStack_4a8 + (float)uStack_4b8;
      uStack_4a8._4_4_ = uStack_4a8._4_4_ + uStack_4b8._4_4_;
      uStack_618._0_4_ = (float)uStack_4a8;
      uStack_618._4_4_ = uStack_4a8._4_4_;
      local_520 = local_620;
      uStack_518 = uStack_618;
      local_690 = (float)local_620._0_4_ * (float)local_620._0_4_;
      fStack_68c = (float)local_620._4_4_ * (float)local_620._4_4_;
      fStack_688 = (float)uStack_4a8 * (float)uStack_4a8;
      fStack_684 = uStack_4a8._4_4_ * uStack_4a8._4_4_;
      uStack_698._0_4_ = 0x3d9021bb;
      local_6a0 = (undefined1  [8])0x3d9021bb3d9021bb;
      uStack_698._4_4_ = 0x3d9021bb;
      local_468 = local_6a0;
      local_450 = local_620;
      local_378 = ::_ps_cephes_log_p1;
      local_310 = 0x3d9021bb3d9021bb;
      uStack_308 = uStack_698;
      local_320 = local_620;
      uStack_318 = uStack_618;
      local_330[0] = -0.1151461;
      local_330[1] = -0.1151461;
      afStack_328[0] = -0.1151461;
      afStack_328[1] = -0.1151461;
      auVar86._8_4_ = -0.1151461;
      auVar86._12_4_ = -0.1151461;
      auVar86._0_4_ = -0.1151461;
      auVar86._4_4_ = -0.1151461;
      auVar22 = vfmadd213ps_fma(_local_620,_local_6a0,auVar86);
      local_390 = ::_ps_cephes_log_p2;
      local_6a0 = auVar22._0_8_;
      local_2e0 = local_6a0;
      uStack_698 = auVar22._8_8_;
      uStack_2d8 = uStack_698;
      local_2f0 = local_620;
      uStack_2e8 = uStack_618;
      local_300[0] = 0.116769984;
      local_300[1] = 0.116769984;
      afStack_2f8[0] = 0.116769984;
      afStack_2f8[1] = 0.116769984;
      auVar87._8_4_ = 0.116769984;
      auVar87._12_4_ = 0.116769984;
      auVar87._0_4_ = 0.116769984;
      auVar87._4_4_ = 0.116769984;
      auVar22 = vfmadd213ps_fma(_local_620,auVar22,auVar87);
      local_3a8 = ::_ps_cephes_log_p3;
      local_6a0 = auVar22._0_8_;
      local_2b0 = local_6a0;
      uStack_698 = auVar22._8_8_;
      uStack_2a8 = uStack_698;
      local_2c0 = local_620;
      uStack_2b8 = uStack_618;
      local_2d0[0] = -0.12420141;
      local_2d0[1] = -0.12420141;
      afStack_2c8[0] = -0.12420141;
      afStack_2c8[1] = -0.12420141;
      auVar88._8_4_ = -0.12420141;
      auVar88._12_4_ = -0.12420141;
      auVar88._0_4_ = -0.12420141;
      auVar88._4_4_ = -0.12420141;
      auVar22 = vfmadd213ps_fma(_local_620,auVar22,auVar88);
      local_3c0 = ::_ps_cephes_log_p4;
      local_6a0 = auVar22._0_8_;
      local_280 = local_6a0;
      uStack_698 = auVar22._8_8_;
      uStack_278 = uStack_698;
      local_290 = local_620;
      uStack_288 = uStack_618;
      local_2a0[0] = 0.14249323;
      local_2a0[1] = 0.14249323;
      afStack_298[0] = 0.14249323;
      afStack_298[1] = 0.14249323;
      auVar89._8_4_ = 0.14249323;
      auVar89._12_4_ = 0.14249323;
      auVar89._0_4_ = 0.14249323;
      auVar89._4_4_ = 0.14249323;
      auVar22 = vfmadd213ps_fma(_local_620,auVar22,auVar89);
      local_3d8 = ::_ps_cephes_log_p5;
      local_6a0 = auVar22._0_8_;
      local_250 = local_6a0;
      uStack_698 = auVar22._8_8_;
      uStack_248 = uStack_698;
      local_260 = local_620;
      uStack_258 = uStack_618;
      local_270[0] = -0.16668057;
      local_270[1] = -0.16668057;
      afStack_268[0] = -0.16668057;
      afStack_268[1] = -0.16668057;
      auVar90._8_4_ = -0.16668057;
      auVar90._12_4_ = -0.16668057;
      auVar90._0_4_ = -0.16668057;
      auVar90._4_4_ = -0.16668057;
      auVar22 = vfmadd213ps_fma(_local_620,auVar22,auVar90);
      local_3f0 = ::_ps_cephes_log_p6;
      local_6a0 = auVar22._0_8_;
      local_220 = local_6a0;
      uStack_698 = auVar22._8_8_;
      uStack_218 = uStack_698;
      local_230 = local_620;
      uStack_228 = uStack_618;
      local_240[0] = 0.20000714;
      local_240[1] = 0.20000714;
      afStack_238[0] = 0.20000714;
      afStack_238[1] = 0.20000714;
      auVar91._8_4_ = 0.20000714;
      auVar91._12_4_ = 0.20000714;
      auVar91._0_4_ = 0.20000714;
      auVar91._4_4_ = 0.20000714;
      auVar22 = vfmadd213ps_fma(_local_620,auVar22,auVar91);
      local_408 = ::_ps_cephes_log_p7;
      local_6a0 = auVar22._0_8_;
      local_1f0 = local_6a0;
      uStack_698 = auVar22._8_8_;
      uStack_1e8 = uStack_698;
      local_200 = local_620;
      uStack_1f8 = uStack_618;
      local_210[0] = -0.24999994;
      local_210[1] = -0.24999994;
      afStack_208[0] = -0.24999994;
      afStack_208[1] = -0.24999994;
      auVar92._8_4_ = -0.24999994;
      auVar92._12_4_ = -0.24999994;
      auVar92._0_4_ = -0.24999994;
      auVar92._4_4_ = -0.24999994;
      auVar22 = vfmadd213ps_fma(_local_620,auVar22,auVar92);
      local_420 = ::_ps_cephes_log_p8;
      local_6a0 = auVar22._0_8_;
      local_1c0 = local_6a0;
      uStack_698 = auVar22._8_8_;
      uStack_1b8 = uStack_698;
      local_1d0 = local_620;
      uStack_1c8 = uStack_618;
      local_1e0[0] = 0.3333333;
      local_1e0[1] = 0.3333333;
      afStack_1d8[0] = 0.3333333;
      afStack_1d8[1] = 0.3333333;
      auVar93._8_4_ = 0.3333333;
      auVar93._12_4_ = 0.3333333;
      auVar93._0_4_ = 0.3333333;
      auVar93._4_4_ = 0.3333333;
      auVar22 = vfmadd213ps_fma(_local_620,auVar22,auVar93);
      local_6a0 = auVar22._0_8_;
      uVar27 = local_6a0;
      uStack_698 = auVar22._8_8_;
      uVar28 = uStack_698;
      local_540 = local_620;
      uStack_538 = uStack_618;
      local_530._0_4_ = auVar22._0_4_;
      local_530._4_4_ = auVar22._4_4_;
      uStack_528._0_4_ = auVar22._8_4_;
      uStack_528._4_4_ = auVar22._12_4_;
      local_6a0._4_4_ = local_530._4_4_ * (float)local_620._4_4_;
      local_6a0._0_4_ = (float)local_530 * (float)local_620._0_4_;
      uStack_698._0_4_ = (float)uStack_528 * (float)uStack_4a8;
      uStack_698._4_4_ = uStack_528._4_4_ * uStack_4a8._4_4_;
      local_550 = local_6a0;
      uStack_548 = uStack_698;
      local_560 = CONCAT44(fStack_68c,local_690);
      uStack_558 = CONCAT44(fStack_684,fStack_688);
      local_6a0._4_4_ = local_530._4_4_ * (float)local_620._4_4_ * fStack_68c;
      local_6a0._0_4_ = (float)local_530 * (float)local_620._0_4_ * local_690;
      uStack_698._0_4_ = (float)uStack_528 * (float)uStack_4a8 * fStack_688;
      uStack_698._4_4_ = uStack_528._4_4_ * uStack_4a8._4_4_ * fStack_684;
      local_440 = local_660;
      local_430 = ::_ps_cephes_log_q1;
      local_190 = local_660;
      uStack_188 = uStack_658;
      local_1a0[0] = -0.00021219444;
      local_1a0[1] = -0.00021219444;
      afStack_198[0] = -0.00021219444;
      afStack_198[1] = -0.00021219444;
      local_1b0 = local_6a0;
      uStack_1a8 = uStack_698;
      auVar94._8_4_ = -0.00021219444;
      auVar94._12_4_ = -0.00021219444;
      auVar94._0_4_ = -0.00021219444;
      auVar94._4_4_ = -0.00021219444;
      auVar22 = vfmadd213ps_fma(auVar94,_local_660,_local_6a0);
      local_458 = &local_690;
      local_460 = ::_ps_0p5;
      local_340 = CONCAT44(fStack_68c,local_690);
      uStack_338 = CONCAT44(fStack_684,fStack_688);
      auVar105._4_4_ = fStack_68c;
      auVar105._0_4_ = local_690;
      auVar105._8_4_ = fStack_688;
      auVar105._12_4_ = fStack_684;
      local_350[0] = 0.5;
      local_350[1] = 0.5;
      afStack_348[0] = 0.5;
      afStack_348[1] = 0.5;
      local_6a0 = auVar22._0_8_;
      local_360 = local_6a0;
      uStack_698 = auVar22._8_8_;
      uStack_358 = uStack_698;
      auVar85._8_4_ = 0.5;
      auVar85._12_4_ = 0.5;
      auVar85._0_4_ = 0.5;
      auVar85._4_4_ = 0.5;
      _local_6a0 = vfnmadd213ps_fma(auVar85,auVar105,auVar22);
      local_4d0 = local_620;
      uStack_4c8 = uStack_618;
      local_4e0._0_4_ = local_6a0._0_4_;
      local_4e0._4_4_ = local_6a0._4_4_;
      uStack_4d8._0_4_ = local_6a0._8_4_;
      uStack_4d8._4_4_ = local_6a0._12_4_;
      local_620._4_4_ = (float)local_620._4_4_ + local_4e0._4_4_;
      local_620._0_4_ = (float)local_620._0_4_ + (float)local_4e0;
      uStack_618._0_4_ = (float)uStack_4a8 + (float)uStack_4d8;
      uStack_618._4_4_ = uStack_4a8._4_4_ + uStack_4d8._4_4_;
      local_448 = ::_ps_cephes_log_q2;
      local_160 = local_660;
      uStack_158 = uStack_658;
      local_170[0] = 0.6933594;
      local_170[1] = 0.6933594;
      afStack_168[0] = 0.6933594;
      afStack_168[1] = 0.6933594;
      local_180 = local_620;
      uStack_178 = uStack_618;
      auVar95._8_4_ = 0.6933594;
      auVar95._12_4_ = 0.6933594;
      auVar95._0_4_ = 0.6933594;
      auVar95._4_4_ = 0.6933594;
      auVar22 = vfmadd213ps_fma(auVar95,_local_660,_local_620);
      local_620 = auVar22._0_8_;
      local_f0 = local_620;
      uStack_618 = auVar22._8_8_;
      uStack_e8 = uStack_618;
      local_100 = local_650._0_8_;
      uStack_f8 = local_650._8_8_;
      _local_6b0 = vpor_avx(auVar22,local_650);
      local_64 = 0x3ede5bd9;
      local_80 = 0x3ede5bd9;
      local_6c0 = 0x3ede5bd93ede5bd9;
      uStack_6b8 = 0x3ede5bd93ede5bd9;
      local_2af0._4_4_ = (float)local_6b0._4_4_ * 0.4342945;
      uStack_2ae8._4_4_ = fStack_6a4 * 0.4342945;
      local_2af0 = CONCAT44(local_2af0._4_4_,(float)local_6b0._0_4_ * 0.4342945);
      uStack_2ae8 = CONCAT44(uStack_2ae8._4_4_,fStack_6a8 * 0.4342945);
      local_2910 = local_2a30;
      auVar16._8_8_ = uStack_2ae8;
      auVar16._0_8_ = local_2af0;
      *(undefined1 (*) [16])*local_2a30 = auVar16;
      local_2a30 = (undefined1 (*) [64])(*local_2a30 + 0x10);
      local_2920 = local_2af0;
      uStack_2918 = uStack_2ae8;
      _local_620 = _local_6b0;
      local_530 = uVar27;
      uStack_528 = uVar28;
      local_510 = local_520;
      uStack_508 = uStack_518;
      local_4e0 = local_6a0;
      uStack_4d8 = uStack_698;
      local_4c0 = local_680._0_8_;
      uStack_4b8 = local_680._8_8_;
      local_4b0 = uVar25;
      uStack_4a8 = uVar26;
      local_490 = uVar21;
      uStack_488 = uVar24;
      local_438 = local_468;
      local_428 = local_440;
      local_418 = local_450;
      local_410 = local_468;
      local_400 = local_450;
      local_3f8 = local_468;
      local_3e8 = local_450;
      local_3e0 = local_468;
      local_3d0 = local_450;
      local_3c8 = local_468;
      local_3b8 = local_450;
      local_3b0 = local_468;
      local_3a0 = local_450;
      local_398 = local_468;
      local_388 = local_450;
      local_380 = local_468;
      local_370 = local_450;
      local_368 = local_468;
      local_140 = local_4f0;
      uStack_138 = uStack_4e8;
      uStack_7c = local_80;
      uStack_78 = local_80;
      uStack_74 = local_80;
    }
    for (; uStack_2ac8._4_4_ = uVar117, uStack_2ad0._4_4_ = fVar116, uStack_2ad8._4_4_ = fVar115,
        local_2ae0._4_4_ = fVar121, uStack_2ac8 = uVar28, uStack_2ad0 = uVar27, uStack_2ad8 = uVar26
        , local_2ae0 = uVar25, uStack_2ae8 = uVar24, local_2af0 = uVar21,
        uVar117 = uStack_2ac8._4_4_, fVar107 = uStack_2ad0._4_4_, fVar106 = uStack_2ad8._4_4_,
        fVar116 = local_2ae0._4_4_, fVar115 = uStack_2ae8._4_4_, fVar121 = local_2af0._4_4_,
        local_2a7c < local_2a24; local_2a7c = local_2a7c + 1) {
      local_58 = local_2a09;
      local_60 = local_2a30;
      uVar21 = local_2af0;
      local_2af0._4_4_ = fVar121;
      uVar24 = uStack_2ae8;
      uStack_2ae8._4_4_ = fVar115;
      uVar25 = local_2ae0;
      local_2ae0._4_4_ = fVar116;
      uVar26 = uStack_2ad8;
      uStack_2ad8._4_4_ = fVar106;
      uVar27 = uStack_2ad0;
      uStack_2ad0._4_4_ = fVar107;
      uVar28 = uStack_2ac8;
      uStack_2ac8._4_4_ = uVar117;
      fVar121 = log10f(*(float *)*local_2a30);
      uVar28 = uStack_2ac8;
      uVar27 = uStack_2ad0;
      uVar26 = uStack_2ad8;
      uVar25 = local_2ae0;
      uVar24 = uStack_2ae8;
      uVar21 = local_2af0;
      *(float *)*local_2a30 = fVar121;
      local_2a30 = (undefined1 (*) [64])(*local_2a30 + 4);
      fVar121 = local_2ae0._4_4_;
      fVar115 = uStack_2ad8._4_4_;
      fVar116 = uStack_2ad0._4_4_;
      uVar117 = uStack_2ac8._4_4_;
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}